

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

void secp256k1_ellswift_elligatorswift_var
               (uchar *u32,secp256k1_fe *t,secp256k1_ge *p,secp256k1_sha256 *hasher)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar529 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar544 [16];
  undefined1 auVar545 [16];
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar549 [16];
  undefined1 auVar550 [16];
  undefined1 auVar551 [16];
  undefined1 auVar552 [16];
  undefined1 auVar553 [16];
  undefined1 auVar554 [16];
  undefined1 auVar555 [16];
  undefined1 auVar556 [16];
  undefined1 auVar557 [16];
  undefined1 auVar558 [16];
  undefined1 auVar559 [16];
  undefined1 auVar560 [16];
  undefined1 auVar561 [16];
  undefined1 auVar562 [16];
  undefined1 auVar563 [16];
  undefined1 auVar564 [16];
  undefined1 auVar565 [16];
  undefined1 auVar566 [16];
  undefined1 auVar567 [16];
  undefined1 auVar568 [16];
  undefined1 auVar569 [16];
  undefined1 auVar570 [16];
  undefined1 auVar571 [16];
  undefined1 auVar572 [16];
  undefined1 auVar573 [16];
  undefined1 auVar574 [16];
  undefined1 auVar575 [16];
  undefined1 auVar576 [16];
  undefined1 auVar577 [16];
  undefined1 auVar578 [16];
  undefined1 auVar579 [16];
  undefined1 auVar580 [16];
  undefined1 auVar581 [16];
  undefined1 auVar582 [16];
  undefined1 auVar583 [16];
  undefined1 auVar584 [16];
  undefined1 auVar585 [16];
  undefined1 auVar586 [16];
  undefined1 auVar587 [16];
  undefined1 auVar588 [16];
  undefined1 auVar589 [16];
  undefined1 auVar590 [16];
  undefined1 auVar591 [16];
  undefined1 auVar592 [16];
  undefined1 auVar593 [16];
  undefined1 auVar594 [16];
  undefined1 auVar595 [16];
  undefined1 auVar596 [16];
  undefined1 auVar597 [16];
  undefined1 auVar598 [16];
  undefined1 auVar599 [16];
  undefined1 auVar600 [16];
  undefined1 auVar601 [16];
  undefined1 auVar602 [16];
  undefined1 auVar603 [16];
  undefined1 auVar604 [16];
  undefined1 auVar605 [16];
  undefined1 auVar606 [16];
  undefined1 auVar607 [16];
  undefined1 auVar608 [16];
  undefined1 auVar609 [16];
  undefined1 auVar610 [16];
  undefined1 auVar611 [16];
  undefined1 auVar612 [16];
  undefined1 auVar613 [16];
  undefined1 auVar614 [16];
  undefined1 auVar615 [16];
  undefined1 auVar616 [16];
  undefined1 auVar617 [16];
  undefined1 auVar618 [16];
  undefined1 auVar619 [16];
  undefined1 auVar620 [16];
  undefined1 auVar621 [16];
  undefined1 auVar622 [16];
  undefined1 auVar623 [16];
  undefined1 auVar624 [16];
  undefined1 auVar625 [16];
  undefined1 auVar626 [16];
  undefined1 auVar627 [16];
  undefined1 auVar628 [16];
  undefined1 auVar629 [16];
  undefined1 auVar630 [16];
  undefined1 auVar631 [16];
  undefined1 auVar632 [16];
  undefined1 auVar633 [16];
  undefined1 auVar634 [16];
  undefined1 auVar635 [16];
  undefined1 auVar636 [16];
  undefined1 auVar637 [16];
  undefined1 auVar638 [16];
  undefined1 auVar639 [16];
  undefined1 auVar640 [16];
  undefined1 auVar641 [16];
  undefined1 auVar642 [16];
  undefined1 auVar643 [16];
  undefined1 auVar644 [16];
  undefined1 auVar645 [16];
  undefined1 auVar646 [16];
  undefined1 auVar647 [16];
  undefined1 auVar648 [16];
  undefined1 auVar649 [16];
  undefined1 auVar650 [16];
  undefined1 auVar651 [16];
  undefined1 auVar652 [16];
  undefined1 auVar653 [16];
  undefined1 auVar654 [16];
  undefined1 auVar655 [16];
  undefined1 auVar656 [16];
  undefined1 auVar657 [16];
  undefined1 auVar658 [16];
  undefined1 auVar659 [16];
  undefined1 auVar660 [16];
  undefined1 auVar661 [16];
  undefined1 auVar662 [16];
  undefined1 auVar663 [16];
  undefined1 auVar664 [16];
  undefined1 auVar665 [16];
  undefined1 auVar666 [16];
  undefined1 auVar667 [16];
  undefined1 auVar668 [16];
  undefined1 auVar669 [16];
  undefined1 auVar670 [16];
  undefined1 auVar671 [16];
  undefined1 auVar672 [16];
  undefined1 auVar673 [16];
  undefined1 auVar674 [16];
  undefined1 auVar675 [16];
  undefined1 auVar676 [16];
  undefined1 auVar677 [16];
  undefined1 auVar678 [16];
  undefined1 auVar679 [16];
  undefined1 auVar680 [16];
  undefined1 auVar681 [16];
  undefined1 auVar682 [16];
  undefined1 auVar683 [16];
  undefined1 auVar684 [16];
  undefined1 auVar685 [16];
  undefined1 auVar686 [16];
  undefined1 auVar687 [16];
  undefined1 auVar688 [16];
  undefined1 auVar689 [16];
  undefined1 auVar690 [16];
  undefined1 auVar691 [16];
  undefined1 auVar692 [16];
  undefined1 auVar693 [16];
  undefined1 auVar694 [16];
  undefined1 auVar695 [16];
  undefined1 auVar696 [16];
  undefined1 auVar697 [16];
  undefined1 auVar698 [16];
  undefined1 auVar699 [16];
  undefined1 auVar700 [16];
  undefined1 auVar701 [16];
  undefined1 auVar702 [16];
  undefined1 auVar703 [16];
  undefined1 auVar704 [16];
  undefined1 auVar705 [16];
  undefined1 auVar706 [16];
  undefined1 auVar707 [16];
  undefined1 auVar708 [16];
  undefined1 auVar709 [16];
  undefined1 auVar710 [16];
  undefined1 auVar711 [16];
  undefined1 auVar712 [16];
  undefined1 auVar713 [16];
  undefined1 auVar714 [16];
  undefined1 auVar715 [16];
  undefined1 auVar716 [16];
  undefined1 auVar717 [16];
  undefined1 auVar718 [16];
  undefined1 auVar719 [16];
  undefined1 auVar720 [16];
  undefined1 auVar721 [16];
  undefined1 auVar722 [16];
  undefined1 auVar723 [16];
  undefined1 auVar724 [16];
  undefined1 auVar725 [16];
  undefined1 auVar726 [16];
  undefined1 auVar727 [16];
  undefined1 auVar728 [16];
  undefined1 auVar729 [16];
  undefined1 auVar730 [16];
  byte bVar731;
  undefined1 auVar732 [16];
  undefined1 auVar733 [16];
  undefined1 auVar734 [16];
  undefined1 auVar735 [16];
  undefined1 auVar736 [16];
  undefined1 auVar737 [16];
  undefined1 auVar738 [16];
  undefined1 auVar739 [16];
  undefined1 auVar740 [16];
  undefined1 auVar741 [16];
  undefined1 auVar742 [16];
  undefined1 auVar743 [16];
  undefined1 auVar744 [16];
  undefined1 auVar745 [16];
  undefined1 auVar746 [16];
  undefined1 auVar747 [16];
  undefined1 auVar748 [16];
  undefined1 auVar749 [16];
  undefined1 auVar750 [16];
  undefined1 auVar751 [16];
  undefined1 auVar752 [16];
  undefined1 auVar753 [16];
  undefined1 auVar754 [16];
  undefined1 auVar755 [16];
  undefined1 auVar756 [16];
  undefined1 auVar757 [16];
  undefined1 auVar758 [16];
  undefined1 auVar759 [16];
  undefined1 auVar760 [16];
  undefined1 auVar761 [16];
  undefined1 auVar762 [16];
  undefined1 auVar763 [16];
  undefined1 auVar764 [16];
  undefined1 auVar765 [16];
  undefined1 auVar766 [16];
  undefined1 auVar767 [16];
  undefined1 auVar768 [16];
  undefined1 auVar769 [16];
  undefined1 auVar770 [16];
  undefined1 auVar771 [16];
  undefined1 auVar772 [16];
  undefined1 auVar773 [16];
  undefined1 auVar774 [16];
  undefined1 auVar775 [16];
  undefined1 auVar776 [16];
  undefined1 auVar777 [16];
  undefined1 auVar778 [16];
  undefined1 auVar779 [16];
  undefined1 auVar780 [16];
  undefined1 auVar781 [16];
  undefined1 auVar782 [16];
  undefined1 auVar783 [16];
  undefined1 auVar784 [16];
  undefined1 auVar785 [16];
  undefined1 auVar786 [16];
  secp256k1_sha256 *hasher_00;
  secp256k1_fe *r_00;
  int iVar787;
  ulong uVar788;
  ulong uVar789;
  ulong uVar790;
  ulong uVar791;
  long lVar792;
  uint32_t cnt;
  ulong uVar793;
  uint32_t cnt_00;
  ulong uVar794;
  ulong uVar795;
  ulong uVar796;
  long lVar797;
  ulong uVar798;
  ulong uVar799;
  ulong uVar800;
  long lVar801;
  ulong uVar802;
  ulong uVar803;
  ulong uVar804;
  ulong uVar805;
  ulong uVar806;
  ulong uVar807;
  ulong uVar808;
  ulong uVar809;
  ulong uVar810;
  ulong uVar811;
  ulong uVar812;
  long lVar813;
  ulong uVar814;
  ulong uVar815;
  bool bVar816;
  uint64_t a2;
  uint64_t a3;
  uint64_t a1;
  secp256k1_fe s;
  secp256k1_fe r;
  secp256k1_fe u;
  uchar branch_hash [32];
  secp256k1_fe local_1c8;
  ulong local_1a0;
  ulong local_198;
  uint local_18c;
  secp256k1_fe local_188;
  undefined1 local_158 [16];
  long local_148;
  secp256k1_sha256 *local_140;
  secp256k1_ge *local_138;
  secp256k1_fe local_130;
  secp256k1_fe *local_108;
  ulong local_100;
  secp256k1_fe local_f8;
  secp256k1_fe local_d0;
  secp256k1_fe local_a8;
  secp256k1_fe local_80;
  byte local_58 [40];
  
  cnt = 0;
  iVar787 = 0;
  local_140 = hasher;
  local_138 = p;
  local_108 = t;
  do {
    hasher_00 = local_140;
    cnt_00 = cnt;
    if (iVar787 == 0) {
      cnt_00 = cnt + 1;
      secp256k1_ellswift_prng(local_58,local_140,cnt);
      iVar787 = 0x40;
    }
    local_198 = CONCAT44(local_198._4_4_,iVar787 - 1U);
    bVar731 = local_58[iVar787 - 1U >> 1] >> ((char)iVar787 * '\x04' - 4U & 4);
    secp256k1_ellswift_prng(u32,hasher_00,cnt_00);
    secp256k1_fe_impl_set_b32_mod(&local_a8,u32);
    uVar802 = (local_138->x).n[4];
    uVar807 = (uVar802 >> 0x30) * 0x1000003d1 + (local_138->x).n[0];
    uVar814 = (uVar807 >> 0x34) + (local_138->x).n[1];
    uVar809 = (uVar814 >> 0x34) + (local_138->x).n[2];
    uVar806 = (uVar809 >> 0x34) + (local_138->x).n[3];
    uVar798 = (local_a8.n[4] >> 0x30) * 0x1000003d1 + local_a8.n[0];
    uVar795 = (uVar798 >> 0x34) + local_a8.n[1];
    uVar794 = (uVar795 >> 0x34) + local_a8.n[2];
    uVar793 = (uVar794 >> 0x34) + local_a8.n[3];
    uVar802 = (uVar806 >> 0x34) + (uVar802 & 0xffffffffffff);
    uVar803 = (uVar793 >> 0x34) + (local_a8.n[4] & 0xffffffffffff);
    uVar807 = uVar807 & 0xfffffffffffff;
    uVar814 = uVar814 & 0xfffffffffffff;
    uVar809 = uVar809 & 0xfffffffffffff;
    uVar806 = uVar806 & 0xfffffffffffff;
    uVar798 = uVar798 & 0xfffffffffffff;
    uVar795 = uVar795 & 0xfffffffffffff;
    uVar794 = uVar794 & 0xfffffffffffff;
    uVar793 = uVar793 & 0xfffffffffffff;
    local_18c = (uint)bVar731;
    if ((bVar731 & 2) == 0) {
      local_1c8.n[0] = (0x5ffff9ffffe91a - uVar798) - uVar807;
      local_1c8.n[4] = 0x5fffffffffffa - (uVar802 + uVar803);
      local_1c8.n[1] = 0x5ffffffffffffa - (uVar795 + uVar814);
      local_1c8.n[2] = 0x5ffffffffffffa - (uVar794 + uVar809);
      local_1c8.n[3] = 0x5ffffffffffffa - (uVar793 + uVar806);
      uVar804 = local_1c8.n[0] * 2;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_1c8.n[3];
      auVar404._8_8_ = 0;
      auVar404._0_8_ = uVar804;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_1c8.n[2];
      auVar405._8_8_ = 0;
      auVar405._0_8_ = local_1c8.n[1] * 2;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_1c8.n[4];
      auVar406._8_8_ = 0;
      auVar406._0_8_ = local_1c8.n[4];
      auVar4._8_8_ = 0;
      auVar4._0_8_ = SUB168(auVar3 * auVar406,0);
      auVar169 = auVar2 * auVar405 + auVar1 * auVar404 + auVar4 * ZEXT816(0x1000003d10);
      uVar796 = local_1c8.n[4] * 2;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar796;
      auVar407._8_8_ = 0;
      auVar407._0_8_ = local_1c8.n[0];
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_1c8.n[3];
      auVar408._8_8_ = 0;
      auVar408._0_8_ = local_1c8.n[1] * 2;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_1c8.n[2];
      auVar409._8_8_ = 0;
      auVar409._0_8_ = local_1c8.n[2];
      auVar8._8_8_ = 0;
      auVar8._0_8_ = SUB168(auVar3 * auVar406,8);
      auVar167 = auVar8 * ZEXT816(0x1000003d10000) +
                 auVar5 * auVar407 + auVar7 * auVar409 + auVar6 * auVar408 + (auVar169 >> 0x34);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_1c8.n[0];
      auVar410._8_8_ = 0;
      auVar410._0_8_ = local_1c8.n[0];
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar796;
      auVar411._8_8_ = 0;
      auVar411._0_8_ = local_1c8.n[1];
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_1c8.n[3];
      auVar412._8_8_ = 0;
      auVar412._0_8_ = local_1c8.n[2] * 2;
      auVar168 = auVar11 * auVar412 + auVar10 * auVar411 + (auVar167 >> 0x34);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = (auVar168._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar167._6_2_ & 0xf);
      auVar170 = auVar12 * ZEXT816(0x1000003d1) + auVar9 * auVar410;
      uVar788 = auVar170._0_8_;
      auVar783._8_8_ = 0;
      auVar783._0_8_ = auVar170._8_8_ << 0xc | uVar788 >> 0x34;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_1c8.n[1];
      auVar413._8_8_ = 0;
      auVar413._0_8_ = uVar804;
      uVar788 = uVar788 & 0xfffffffffffff;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uVar796;
      auVar414._8_8_ = 0;
      auVar414._0_8_ = local_1c8.n[2];
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_1c8.n[3];
      auVar415._8_8_ = 0;
      auVar415._0_8_ = local_1c8.n[3];
      auVar168 = auVar15 * auVar415 + auVar14 * auVar414 + (auVar168 >> 0x34);
      uVar789 = auVar168._0_8_;
      auVar732._8_8_ = 0;
      auVar732._0_8_ = auVar168._8_8_ << 0xc | uVar789 >> 0x34;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = uVar789 & 0xfffffffffffff;
      auVar783 = auVar13 * auVar413 + auVar16 * ZEXT816(0x1000003d10) + auVar783;
      uVar808 = auVar783._0_8_;
      auVar733._8_8_ = 0;
      auVar733._0_8_ = auVar783._8_8_ * 0x1000 | uVar808 >> 0x34;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_1c8.n[2];
      auVar416._8_8_ = 0;
      auVar416._0_8_ = uVar804;
      uVar808 = uVar808 & 0xfffffffffffff;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_1c8.n[1];
      auVar417._8_8_ = 0;
      auVar417._0_8_ = local_1c8.n[1];
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uVar796;
      auVar418._8_8_ = 0;
      auVar418._0_8_ = local_1c8.n[3];
      auVar732 = auVar19 * auVar418 + auVar732;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = auVar732._0_8_;
      auVar733 = auVar20 * ZEXT816(0x1000003d10) + auVar18 * auVar417 + auVar17 * auVar416 +
                 auVar733;
      auVar168 = auVar733 >> 0x34;
      auVar735._8_8_ = 0;
      auVar735._0_8_ = auVar168._0_8_;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = auVar732._8_8_;
      uVar815 = auVar733._0_8_ & 0xfffffffffffff;
      auVar734._8_8_ = auVar168._8_8_;
      auVar734._0_8_ = auVar169._0_8_ & 0xffffffffffffe;
      auVar735 = auVar21 * ZEXT816(0x1000003d10000) + auVar734 + auVar735;
      uVar804 = auVar735._0_8_;
      uVar805 = uVar804 & 0xfffffffffffff;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = uVar788;
      auVar419._8_8_ = 0;
      auVar419._0_8_ = local_1c8.n[3];
      uVar796 = (auVar735._8_8_ << 0xc | uVar804 >> 0x34) + (auVar167._0_8_ & 0xffffffffffff);
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uVar808;
      auVar420._8_8_ = 0;
      auVar420._0_8_ = local_1c8.n[2];
      auVar24._8_8_ = 0;
      auVar24._0_8_ = uVar815;
      auVar421._8_8_ = 0;
      auVar421._0_8_ = local_1c8.n[1];
      auVar25._8_8_ = 0;
      auVar25._0_8_ = uVar805;
      auVar422._8_8_ = 0;
      auVar422._0_8_ = local_1c8.n[0];
      auVar26._8_8_ = 0;
      auVar26._0_8_ = uVar796;
      auVar423._8_8_ = 0;
      auVar423._0_8_ = local_1c8.n[4];
      auVar27._8_8_ = 0;
      auVar27._0_8_ = SUB168(auVar26 * auVar423,0);
      auVar170 = auVar23 * auVar420 + auVar22 * auVar419 + auVar24 * auVar421 + auVar25 * auVar422 +
                 auVar27 * ZEXT816(0x1000003d10);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = uVar788;
      auVar424._8_8_ = 0;
      auVar424._0_8_ = local_1c8.n[4];
      auVar29._8_8_ = 0;
      auVar29._0_8_ = uVar808;
      auVar425._8_8_ = 0;
      auVar425._0_8_ = local_1c8.n[3];
      auVar30._8_8_ = 0;
      auVar30._0_8_ = uVar815;
      auVar426._8_8_ = 0;
      auVar426._0_8_ = local_1c8.n[2];
      auVar31._8_8_ = 0;
      auVar31._0_8_ = uVar805;
      auVar427._8_8_ = 0;
      auVar427._0_8_ = local_1c8.n[1];
      auVar32._8_8_ = 0;
      auVar32._0_8_ = uVar796;
      auVar428._8_8_ = 0;
      auVar428._0_8_ = local_1c8.n[0];
      auVar33._8_8_ = 0;
      auVar33._0_8_ = SUB168(auVar26 * auVar423,8);
      auVar167 = auVar33 * ZEXT816(0x1000003d10000) +
                 auVar32 * auVar428 +
                 auVar31 * auVar427 + auVar30 * auVar426 + auVar29 * auVar425 + auVar28 * auVar424 +
                 (auVar170 >> 0x34);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = uVar788;
      auVar429._8_8_ = 0;
      auVar429._0_8_ = local_1c8.n[0];
      auVar35._8_8_ = 0;
      auVar35._0_8_ = uVar808;
      auVar430._8_8_ = 0;
      auVar430._0_8_ = local_1c8.n[4];
      auVar36._8_8_ = 0;
      auVar36._0_8_ = uVar815;
      auVar431._8_8_ = 0;
      auVar431._0_8_ = local_1c8.n[3];
      auVar37._8_8_ = 0;
      auVar37._0_8_ = uVar805;
      auVar432._8_8_ = 0;
      auVar432._0_8_ = local_1c8.n[2];
      auVar38._8_8_ = 0;
      auVar38._0_8_ = uVar796;
      auVar433._8_8_ = 0;
      auVar433._0_8_ = local_1c8.n[1];
      auVar168 = auVar38 * auVar433 + auVar37 * auVar432 + auVar36 * auVar431 + auVar35 * auVar430 +
                 (auVar167 >> 0x34);
      auVar39._8_8_ = 0;
      auVar39._0_8_ = (auVar168._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar167._6_2_ & 0xf);
      auVar169 = auVar34 * auVar429 + auVar39 * ZEXT816(0x1000003d1);
      uVar804 = auVar169._0_8_;
      auVar736._8_8_ = 0;
      auVar736._0_8_ = auVar169._8_8_ * 0x1000 | uVar804 >> 0x34;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = uVar788;
      auVar434._8_8_ = 0;
      auVar434._0_8_ = local_1c8.n[1];
      auVar41._8_8_ = 0;
      auVar41._0_8_ = uVar808;
      auVar435._8_8_ = 0;
      auVar435._0_8_ = local_1c8.n[0];
      auVar42._8_8_ = 0;
      auVar42._0_8_ = uVar815;
      auVar436._8_8_ = 0;
      auVar436._0_8_ = local_1c8.n[4];
      auVar43._8_8_ = 0;
      auVar43._0_8_ = uVar805;
      auVar437._8_8_ = 0;
      auVar437._0_8_ = local_1c8.n[3];
      auVar44._8_8_ = 0;
      auVar44._0_8_ = uVar796;
      auVar438._8_8_ = 0;
      auVar438._0_8_ = local_1c8.n[2];
      auVar168 = auVar42 * auVar436 + auVar43 * auVar437 + auVar44 * auVar438 + (auVar168 >> 0x34);
      auVar45._8_8_ = 0;
      auVar45._0_8_ = auVar168._0_8_ & 0xfffffffffffff;
      auVar736 = auVar45 * ZEXT816(0x1000003d10) + auVar40 * auVar434 + auVar41 * auVar435 +
                 auVar736;
      local_80.n[1] = auVar736._0_8_ & 0xfffffffffffff;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = uVar788;
      auVar439._8_8_ = 0;
      auVar439._0_8_ = local_1c8.n[2];
      local_1a0 = SUB168(auVar46 * auVar439,0);
      auVar47._8_8_ = 0;
      auVar47._0_8_ = uVar808;
      auVar440._8_8_ = 0;
      auVar440._0_8_ = local_1c8.n[1];
      auVar48._8_8_ = 0;
      auVar48._0_8_ = uVar815;
      auVar441._8_8_ = 0;
      auVar441._0_8_ = local_1c8.n[0];
      local_148 = SUB168(auVar48 * auVar441,0);
      auVar49._8_8_ = 0;
      auVar49._0_8_ = uVar805;
      auVar442._8_8_ = 0;
      auVar442._0_8_ = local_1c8.n[4];
      auVar50._8_8_ = 0;
      auVar50._0_8_ = uVar796;
      auVar443._8_8_ = 0;
      auVar443._0_8_ = local_1c8.n[3];
      auVar168 = auVar50 * auVar443 + auVar49 * auVar442 + (auVar168 >> 0x34);
      auVar51._8_8_ = 0;
      auVar51._0_8_ = auVar168._0_8_;
      auVar169 = auVar51 * ZEXT816(0x1000003d10) +
                 auVar48 * auVar441 + auVar46 * auVar439 + auVar47 * auVar440 + (auVar736 >> 0x34);
      auVar171 = auVar169 >> 0x34;
      auVar738._8_8_ = 0;
      auVar738._0_8_ = auVar171._0_8_;
      local_80.n[2] = auVar169._0_8_ & 0xfffffffffffff;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = auVar168._8_8_;
      auVar737._8_8_ = auVar171._8_8_;
      auVar737._0_8_ = auVar170._0_8_ & 0xfffffffffffff;
      auVar738 = auVar52 * ZEXT816(0x1000003d10000) + auVar737 + auVar738;
      uVar789 = auVar738._0_8_;
      local_80.n[3] = uVar789 & 0xfffffffffffff;
      local_80.n[4] = (auVar738._8_8_ << 0xc | uVar789 >> 0x34) + (auVar167._0_8_ & 0xffffffffffff);
      local_80.n[0] = (uVar804 & 0xfffffffffffff) + 7;
      iVar787 = secp256k1_fe_impl_is_square_var(&local_80);
      if (iVar787 == 0) {
        auVar53._8_8_ = 0;
        auVar53._0_8_ = uVar806;
        auVar444._8_8_ = 0;
        auVar444._0_8_ = uVar798;
        auVar54._8_8_ = 0;
        auVar54._0_8_ = uVar795;
        auVar445._8_8_ = 0;
        auVar445._0_8_ = uVar809;
        auVar55._8_8_ = 0;
        auVar55._0_8_ = uVar794;
        auVar446._8_8_ = 0;
        auVar446._0_8_ = uVar814;
        auVar56._8_8_ = 0;
        auVar56._0_8_ = uVar793;
        auVar447._8_8_ = 0;
        auVar447._0_8_ = uVar807;
        auVar57._8_8_ = 0;
        auVar57._0_8_ = uVar803;
        auVar448._8_8_ = 0;
        auVar448._0_8_ = uVar802;
        auVar58._8_8_ = 0;
        auVar58._0_8_ = SUB168(auVar57 * auVar448,0);
        auVar169 = auVar54 * auVar445 + auVar53 * auVar444 + auVar55 * auVar446 + auVar56 * auVar447
                   + auVar58 * ZEXT816(0x1000003d10);
        auVar59._8_8_ = 0;
        auVar59._0_8_ = uVar802;
        auVar449._8_8_ = 0;
        auVar449._0_8_ = uVar798;
        auVar60._8_8_ = 0;
        auVar60._0_8_ = uVar795;
        auVar450._8_8_ = 0;
        auVar450._0_8_ = uVar806;
        auVar61._8_8_ = 0;
        auVar61._0_8_ = uVar794;
        auVar451._8_8_ = 0;
        auVar451._0_8_ = uVar809;
        auVar62._8_8_ = 0;
        auVar62._0_8_ = uVar793;
        auVar452._8_8_ = 0;
        auVar452._0_8_ = uVar814;
        auVar63._8_8_ = 0;
        auVar63._0_8_ = uVar803;
        auVar453._8_8_ = 0;
        auVar453._0_8_ = uVar807;
        auVar64._8_8_ = 0;
        auVar64._0_8_ = SUB168(auVar57 * auVar448,8);
        auVar167 = auVar64 * ZEXT816(0x1000003d10000) +
                   auVar63 * auVar453 +
                   auVar62 * auVar452 + auVar61 * auVar451 + auVar59 * auVar449 + auVar60 * auVar450
                   + (auVar169 >> 0x34);
        auVar65._8_8_ = 0;
        auVar65._0_8_ = uVar798;
        auVar454._8_8_ = 0;
        auVar454._0_8_ = uVar807;
        auVar66._8_8_ = 0;
        auVar66._0_8_ = uVar802;
        auVar455._8_8_ = 0;
        auVar455._0_8_ = uVar795;
        auVar67._8_8_ = 0;
        auVar67._0_8_ = uVar794;
        auVar456._8_8_ = 0;
        auVar456._0_8_ = uVar806;
        auVar68._8_8_ = 0;
        auVar68._0_8_ = uVar793;
        auVar457._8_8_ = 0;
        auVar457._0_8_ = uVar809;
        auVar69._8_8_ = 0;
        auVar69._0_8_ = uVar803;
        auVar458._8_8_ = 0;
        auVar458._0_8_ = uVar814;
        auVar168 = auVar69 * auVar458 + auVar68 * auVar457 + auVar67 * auVar456 + auVar66 * auVar455
                   + (auVar167 >> 0x34);
        auVar70._8_8_ = 0;
        auVar70._0_8_ = (auVar168._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar167._6_2_ & 0xf);
        auVar170 = auVar65 * auVar454 + auVar70 * ZEXT816(0x1000003d1);
        uVar804 = auVar170._0_8_;
        auVar739._8_8_ = 0;
        auVar739._0_8_ = auVar170._8_8_ * 0x1000 | uVar804 >> 0x34;
        auVar71._8_8_ = 0;
        auVar71._0_8_ = uVar798;
        auVar459._8_8_ = 0;
        auVar459._0_8_ = uVar814;
        auVar72._8_8_ = 0;
        auVar72._0_8_ = uVar795;
        auVar460._8_8_ = 0;
        auVar460._0_8_ = uVar807;
        auVar73._8_8_ = 0;
        auVar73._0_8_ = uVar794;
        auVar461._8_8_ = 0;
        auVar461._0_8_ = uVar802;
        auVar74._8_8_ = 0;
        auVar74._0_8_ = uVar793;
        auVar462._8_8_ = 0;
        auVar462._0_8_ = uVar806;
        auVar75._8_8_ = 0;
        auVar75._0_8_ = uVar803;
        auVar463._8_8_ = 0;
        auVar463._0_8_ = uVar809;
        auVar168 = auVar75 * auVar463 + auVar74 * auVar462 + auVar73 * auVar461 + (auVar168 >> 0x34)
        ;
        uVar789 = auVar168._0_8_;
        auVar740._8_8_ = 0;
        auVar740._0_8_ = auVar168._8_8_ << 0xc | uVar789 >> 0x34;
        auVar76._8_8_ = 0;
        auVar76._0_8_ = uVar789 & 0xfffffffffffff;
        auVar739 = auVar76 * ZEXT816(0x1000003d10) + auVar71 * auVar459 + auVar72 * auVar460 +
                   auVar739;
        uVar811 = auVar739._0_8_;
        auVar741._8_8_ = 0;
        auVar741._0_8_ = auVar739._8_8_ << 0xc | uVar811 >> 0x34;
        auVar77._8_8_ = 0;
        auVar77._0_8_ = uVar798;
        auVar464._8_8_ = 0;
        auVar464._0_8_ = uVar809;
        auVar78._8_8_ = 0;
        auVar78._0_8_ = uVar795;
        auVar465._8_8_ = 0;
        auVar465._0_8_ = uVar814;
        auVar79._8_8_ = 0;
        auVar79._0_8_ = uVar794;
        auVar466._8_8_ = 0;
        auVar466._0_8_ = uVar807;
        auVar80._8_8_ = 0;
        auVar80._0_8_ = uVar793;
        auVar467._8_8_ = 0;
        auVar467._0_8_ = uVar802;
        auVar81._8_8_ = 0;
        auVar81._0_8_ = uVar803;
        auVar468._8_8_ = 0;
        auVar468._0_8_ = uVar806;
        auVar740 = auVar81 * auVar468 + auVar80 * auVar467 + auVar740;
        auVar82._8_8_ = 0;
        auVar82._0_8_ = auVar740._0_8_;
        auVar741 = auVar82 * ZEXT816(0x1000003d10) +
                   auVar79 * auVar466 + auVar77 * auVar464 + auVar78 * auVar465 + auVar741;
        auVar168 = auVar741 >> 0x34;
        auVar743._8_8_ = 0;
        auVar743._0_8_ = auVar168._0_8_;
        auVar83._8_8_ = 0;
        auVar83._0_8_ = auVar740._8_8_;
        auVar742._8_8_ = auVar168._8_8_;
        auVar742._0_8_ = auVar169._0_8_ & 0xfffffffffffff;
        auVar743 = auVar83 * ZEXT816(0x1000003d10000) + auVar742 + auVar743;
        uVar789 = auVar743._0_8_;
        local_188.n[3] = (uVar789 & 0xfffffffffffff) + (0x3ffffffffffffc - uVar805);
        local_188.n[4] =
             (auVar743._8_8_ << 0xc | uVar789 >> 0x34) + (auVar167._0_8_ & 0xffffffffffff) +
             (0x3fffffffffffc - uVar796);
        local_188.n[0] = (uVar804 & 0xfffffffffffff) + (0x3ffffbfffff0bc - uVar788);
        local_188.n[1] = (uVar811 & 0xfffffffffffff) + (0x3ffffffffffffc - uVar808);
        uVar804 = uVar798 * 2;
        auVar84._8_8_ = 0;
        auVar84._0_8_ = uVar793;
        auVar469._8_8_ = 0;
        auVar469._0_8_ = uVar804;
        local_188.n[2] = (auVar741._0_8_ & 0xfffffffffffff) + (0x3ffffffffffffc - uVar815);
        auVar85._8_8_ = 0;
        auVar85._0_8_ = uVar794;
        auVar470._8_8_ = 0;
        auVar470._0_8_ = uVar795 * 2;
        auVar86._8_8_ = 0;
        auVar86._0_8_ = uVar803;
        auVar471._8_8_ = 0;
        auVar471._0_8_ = uVar803;
        auVar87._8_8_ = 0;
        auVar87._0_8_ = SUB168(auVar86 * auVar471,0);
        auVar167 = auVar87 * ZEXT816(0x1000003d10) + auVar85 * auVar470 + auVar84 * auVar469;
        uVar788 = auVar167._0_8_;
        auVar744._8_8_ = 0;
        auVar744._0_8_ = auVar167._8_8_ << 0xc | uVar788 >> 0x34;
        uVar796 = uVar803 * 2;
        auVar88._8_8_ = 0;
        auVar88._0_8_ = uVar796;
        auVar472._8_8_ = 0;
        auVar472._0_8_ = uVar798;
        auVar89._8_8_ = 0;
        auVar89._0_8_ = uVar793;
        auVar473._8_8_ = 0;
        auVar473._0_8_ = uVar795 * 2;
        auVar90._8_8_ = 0;
        auVar90._0_8_ = uVar794;
        auVar474._8_8_ = 0;
        auVar474._0_8_ = uVar794;
        auVar91._8_8_ = 0;
        auVar91._0_8_ = SUB168(auVar86 * auVar471,8);
        auVar744 = auVar91 * ZEXT816(0x1000003d10000) +
                   auVar88 * auVar472 + auVar90 * auVar474 + auVar89 * auVar473 + auVar744;
        auVar92._8_8_ = 0;
        auVar92._0_8_ = uVar798;
        auVar475._8_8_ = 0;
        auVar475._0_8_ = uVar798;
        auVar93._8_8_ = 0;
        auVar93._0_8_ = uVar796;
        auVar476._8_8_ = 0;
        auVar476._0_8_ = uVar795;
        auVar94._8_8_ = 0;
        auVar94._0_8_ = uVar793;
        auVar477._8_8_ = 0;
        auVar477._0_8_ = uVar794 * 2;
        auVar167 = auVar93 * auVar476 + auVar94 * auVar477 + (auVar744 >> 0x34);
        uVar789 = auVar167._0_8_;
        auVar745._8_8_ = 0;
        auVar745._0_8_ = auVar167._8_8_ << 0xc | uVar789 >> 0x34;
        auVar95._8_8_ = 0;
        auVar95._0_8_ = (uVar789 & 0xfffffffffffff) << 4 | (ulong)(auVar744._6_2_ & 0xf);
        auVar167 = auVar95 * ZEXT816(0x1000003d1) + auVar92 * auVar475;
        uVar789 = auVar167._0_8_;
        auVar746._8_8_ = 0;
        auVar746._0_8_ = auVar167._8_8_ << 0xc | uVar789 >> 0x34;
        auVar96._8_8_ = 0;
        auVar96._0_8_ = uVar795;
        auVar478._8_8_ = 0;
        auVar478._0_8_ = uVar804;
        auVar97._8_8_ = 0;
        auVar97._0_8_ = uVar796;
        auVar479._8_8_ = 0;
        auVar479._0_8_ = uVar794;
        auVar98._8_8_ = 0;
        auVar98._0_8_ = uVar793;
        auVar480._8_8_ = 0;
        auVar480._0_8_ = uVar793;
        auVar745 = auVar98 * auVar480 + auVar97 * auVar479 + auVar745;
        uVar805 = auVar745._0_8_;
        auVar747._8_8_ = 0;
        auVar747._0_8_ = auVar745._8_8_ << 0xc | uVar805 >> 0x34;
        auVar99._8_8_ = 0;
        auVar99._0_8_ = uVar805 & 0xfffffffffffff;
        auVar746 = auVar99 * ZEXT816(0x1000003d10) + auVar96 * auVar478 + auVar746;
        uVar805 = auVar746._0_8_;
        auVar748._8_8_ = 0;
        auVar748._0_8_ = auVar746._8_8_ << 0xc | uVar805 >> 0x34;
        auVar100._8_8_ = 0;
        auVar100._0_8_ = uVar794;
        auVar481._8_8_ = 0;
        auVar481._0_8_ = uVar804;
        auVar101._8_8_ = 0;
        auVar101._0_8_ = uVar795;
        auVar482._8_8_ = 0;
        auVar482._0_8_ = uVar795;
        auVar102._8_8_ = 0;
        auVar102._0_8_ = uVar796;
        auVar483._8_8_ = 0;
        auVar483._0_8_ = uVar793;
        auVar747 = auVar102 * auVar483 + auVar747;
        auVar103._8_8_ = 0;
        auVar103._0_8_ = auVar747._0_8_;
        auVar748 = auVar103 * ZEXT816(0x1000003d10) + auVar101 * auVar482 + auVar100 * auVar481 +
                   auVar748;
        auVar167 = auVar748 >> 0x34;
        auVar750._8_8_ = 0;
        auVar750._0_8_ = auVar167._0_8_;
        auVar104._8_8_ = 0;
        auVar104._0_8_ = auVar747._8_8_;
        auVar749._8_8_ = auVar167._8_8_;
        auVar749._0_8_ = uVar788 & 0xffffffffffffe;
        auVar750 = auVar104 * ZEXT816(0x1000003d10000) + auVar749 + auVar750;
        uVar815 = auVar750._0_8_;
        uVar789 = uVar789 & 0xfffffffffffff;
        auVar105._8_8_ = 0;
        auVar105._0_8_ = uVar789;
        auVar484._8_8_ = 0;
        auVar484._0_8_ = uVar793;
        uVar796 = (auVar750._8_8_ << 0xc | uVar815 >> 0x34) + (auVar744._0_8_ & 0xffffffffffff);
        uVar805 = uVar805 & 0xfffffffffffff;
        auVar106._8_8_ = 0;
        auVar106._0_8_ = uVar805;
        auVar485._8_8_ = 0;
        auVar485._0_8_ = uVar794;
        uVar788 = auVar748._0_8_ & 0xfffffffffffff;
        auVar107._8_8_ = 0;
        auVar107._0_8_ = uVar788;
        auVar486._8_8_ = 0;
        auVar486._0_8_ = uVar795;
        uVar815 = uVar815 & 0xfffffffffffff;
        auVar108._8_8_ = 0;
        auVar108._0_8_ = uVar815;
        auVar487._8_8_ = 0;
        auVar487._0_8_ = uVar798;
        auVar109._8_8_ = 0;
        auVar109._0_8_ = uVar796;
        auVar488._8_8_ = 0;
        auVar488._0_8_ = uVar803;
        auVar110._8_8_ = 0;
        auVar110._0_8_ = SUB168(auVar109 * auVar488,0);
        auVar169 = auVar106 * auVar485 + auVar105 * auVar484 + auVar107 * auVar486 +
                   auVar108 * auVar487 + auVar110 * ZEXT816(0x1000003d10);
        auVar111._8_8_ = 0;
        auVar111._0_8_ = uVar789;
        auVar489._8_8_ = 0;
        auVar489._0_8_ = uVar803;
        auVar112._8_8_ = 0;
        auVar112._0_8_ = uVar805;
        auVar490._8_8_ = 0;
        auVar490._0_8_ = uVar793;
        auVar113._8_8_ = 0;
        auVar113._0_8_ = uVar788;
        auVar491._8_8_ = 0;
        auVar491._0_8_ = uVar794;
        auVar114._8_8_ = 0;
        auVar114._0_8_ = uVar815;
        auVar492._8_8_ = 0;
        auVar492._0_8_ = uVar795;
        auVar115._8_8_ = 0;
        auVar115._0_8_ = uVar796;
        auVar493._8_8_ = 0;
        auVar493._0_8_ = uVar798;
        auVar116._8_8_ = 0;
        auVar116._0_8_ = SUB168(auVar109 * auVar488,8);
        auVar167 = auVar116 * ZEXT816(0x1000003d10000) +
                   auVar115 * auVar493 +
                   auVar114 * auVar492 +
                   auVar113 * auVar491 + auVar112 * auVar490 + auVar111 * auVar489 +
                   (auVar169 >> 0x34);
        auVar117._8_8_ = 0;
        auVar117._0_8_ = uVar789;
        auVar494._8_8_ = 0;
        auVar494._0_8_ = uVar798;
        auVar118._8_8_ = 0;
        auVar118._0_8_ = uVar805;
        auVar495._8_8_ = 0;
        auVar495._0_8_ = uVar803;
        auVar119._8_8_ = 0;
        auVar119._0_8_ = uVar788;
        auVar496._8_8_ = 0;
        auVar496._0_8_ = uVar793;
        auVar120._8_8_ = 0;
        auVar120._0_8_ = uVar815;
        auVar497._8_8_ = 0;
        auVar497._0_8_ = uVar794;
        auVar121._8_8_ = 0;
        auVar121._0_8_ = uVar796;
        auVar498._8_8_ = 0;
        auVar498._0_8_ = uVar795;
        auVar168 = auVar121 * auVar498 +
                   auVar120 * auVar497 + auVar119 * auVar496 + auVar118 * auVar495 +
                   (auVar167 >> 0x34);
        auVar122._8_8_ = 0;
        auVar122._0_8_ = (auVar168._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar167._6_2_ & 0xf);
        auVar170 = auVar122 * ZEXT816(0x1000003d1) + auVar117 * auVar494;
        uVar804 = auVar170._0_8_;
        auVar751._8_8_ = 0;
        auVar751._0_8_ = auVar170._8_8_ * 0x1000 | uVar804 >> 0x34;
        auVar123._8_8_ = 0;
        auVar123._0_8_ = uVar789;
        auVar499._8_8_ = 0;
        auVar499._0_8_ = uVar795;
        local_1a0 = SUB168(auVar123 * auVar499,0);
        auVar124._8_8_ = 0;
        auVar124._0_8_ = uVar805;
        auVar500._8_8_ = 0;
        auVar500._0_8_ = uVar798;
        auVar125._8_8_ = 0;
        auVar125._0_8_ = uVar788;
        auVar501._8_8_ = 0;
        auVar501._0_8_ = uVar803;
        auVar126._8_8_ = 0;
        auVar126._0_8_ = uVar815;
        auVar502._8_8_ = 0;
        auVar502._0_8_ = uVar793;
        auVar127._8_8_ = 0;
        auVar127._0_8_ = uVar796;
        auVar503._8_8_ = 0;
        auVar503._0_8_ = uVar794;
        auVar168 = auVar125 * auVar501 + auVar126 * auVar502 + auVar127 * auVar503 +
                   (auVar168 >> 0x34);
        auVar128._8_8_ = 0;
        auVar128._0_8_ = auVar168._0_8_ & 0xfffffffffffff;
        auVar751 = auVar128 * ZEXT816(0x1000003d10) + auVar123 * auVar499 + auVar124 * auVar500 +
                   auVar751;
        uVar808 = auVar751._0_8_;
        auVar752._8_8_ = 0;
        auVar752._0_8_ = auVar751._8_8_ << 0xc | uVar808 >> 0x34;
        auVar129._8_8_ = 0;
        auVar129._0_8_ = uVar789;
        auVar504._8_8_ = 0;
        auVar504._0_8_ = uVar794;
        auVar130._8_8_ = 0;
        auVar130._0_8_ = uVar805;
        auVar505._8_8_ = 0;
        auVar505._0_8_ = uVar795;
        auVar131._8_8_ = 0;
        auVar131._0_8_ = uVar788;
        auVar506._8_8_ = 0;
        auVar506._0_8_ = uVar798;
        auVar132._8_8_ = 0;
        auVar132._0_8_ = uVar815;
        auVar507._8_8_ = 0;
        auVar507._0_8_ = uVar803;
        auVar133._8_8_ = 0;
        auVar133._0_8_ = uVar796;
        auVar508._8_8_ = 0;
        auVar508._0_8_ = uVar793;
        auVar168 = auVar133 * auVar508 + auVar132 * auVar507 + (auVar168 >> 0x34);
        auVar134._8_8_ = 0;
        auVar134._0_8_ = auVar168._0_8_;
        auVar752 = auVar134 * ZEXT816(0x1000003d10) +
                   auVar131 * auVar506 + auVar130 * auVar505 + auVar129 * auVar504 + auVar752;
        auVar170 = auVar752 >> 0x34;
        auVar754._8_8_ = 0;
        auVar754._0_8_ = auVar170._0_8_;
        auVar135._8_8_ = 0;
        auVar135._0_8_ = auVar168._8_8_;
        auVar753._8_8_ = auVar170._8_8_;
        auVar753._0_8_ = auVar169._0_8_ & 0xfffffffffffff;
        auVar754 = auVar135 * ZEXT816(0x1000003d10000) + auVar753 + auVar754;
        uVar789 = auVar754._0_8_;
        uVar815 = (auVar754._8_8_ << 0xc | uVar789 >> 0x34) + (auVar167._0_8_ & 0xffffffffffff);
        uVar789 = uVar789 & 0xfffffffffffff;
        auVar136._8_8_ = 0;
        auVar136._0_8_ = uVar789;
        auVar509._8_8_ = 0;
        auVar509._0_8_ = local_188.n[0];
        uVar805 = auVar752._0_8_ & 0xfffffffffffff;
        auVar137._8_8_ = 0;
        auVar137._0_8_ = uVar805;
        auVar510._8_8_ = 0;
        auVar510._0_8_ = local_188.n[1];
        uVar808 = uVar808 & 0xfffffffffffff;
        auVar138._8_8_ = 0;
        auVar138._0_8_ = uVar808;
        auVar511._8_8_ = 0;
        auVar511._0_8_ = local_188.n[2];
        uVar804 = (uVar804 & 0xfffffffffffff) + 7;
        auVar139._8_8_ = 0;
        auVar139._0_8_ = uVar804;
        auVar512._8_8_ = 0;
        auVar512._0_8_ = local_188.n[3];
        auVar140._8_8_ = 0;
        auVar140._0_8_ = uVar815;
        auVar513._8_8_ = 0;
        auVar513._0_8_ = local_188.n[4];
        auVar141._8_8_ = 0;
        auVar141._0_8_ = SUB168(auVar140 * auVar513,0);
        auVar167 = auVar141 * ZEXT816(0x1000003d10) +
                   auVar136 * auVar509 +
                   auVar137 * auVar510 + auVar139 * auVar512 + auVar138 * auVar511;
        auVar142._8_8_ = 0;
        auVar142._0_8_ = uVar815;
        auVar514._8_8_ = 0;
        auVar514._0_8_ = local_188.n[0];
        auVar143._8_8_ = 0;
        auVar143._0_8_ = uVar789;
        auVar515._8_8_ = 0;
        auVar515._0_8_ = local_188.n[1];
        auVar144._8_8_ = 0;
        auVar144._0_8_ = uVar805;
        auVar516._8_8_ = 0;
        auVar516._0_8_ = local_188.n[2];
        auVar145._8_8_ = 0;
        auVar145._0_8_ = uVar808;
        auVar517._8_8_ = 0;
        auVar517._0_8_ = local_188.n[3];
        auVar146._8_8_ = 0;
        auVar146._0_8_ = uVar804;
        auVar518._8_8_ = 0;
        auVar518._0_8_ = local_188.n[4];
        auVar147._8_8_ = 0;
        auVar147._0_8_ = SUB168(auVar140 * auVar513,8);
        auVar168 = auVar147 * ZEXT816(0x1000003d10000) +
                   auVar142 * auVar514 +
                   auVar143 * auVar515 +
                   auVar146 * auVar518 + auVar145 * auVar517 + auVar144 * auVar516 +
                   (auVar167 >> 0x34);
        auVar148._8_8_ = 0;
        auVar148._0_8_ = uVar804;
        auVar519._8_8_ = 0;
        auVar519._0_8_ = local_188.n[0];
        auVar149._8_8_ = 0;
        auVar149._0_8_ = uVar815;
        auVar520._8_8_ = 0;
        auVar520._0_8_ = local_188.n[1];
        auVar150._8_8_ = 0;
        auVar150._0_8_ = uVar789;
        auVar521._8_8_ = 0;
        auVar521._0_8_ = local_188.n[2];
        auVar151._8_8_ = 0;
        auVar151._0_8_ = uVar805;
        auVar522._8_8_ = 0;
        auVar522._0_8_ = local_188.n[3];
        auVar152._8_8_ = 0;
        auVar152._0_8_ = uVar808;
        auVar523._8_8_ = 0;
        auVar523._0_8_ = local_188.n[4];
        auVar169 = (auVar168 >> 0x34) +
                   auVar150 * auVar521 + auVar152 * auVar523 + auVar151 * auVar522 +
                   auVar149 * auVar520;
        uVar796 = auVar169._0_8_;
        uVar788 = auVar169._8_8_;
        auVar784._8_8_ = uVar788 >> 0x34;
        auVar784._0_8_ = uVar788 * 0x1000 | uVar796 >> 0x34;
        auVar153._8_8_ = 0;
        auVar153._0_8_ = uVar796 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar168._6_2_ & 0xf);
        auVar169 = auVar148 * auVar519 + auVar153 * ZEXT816(0x1000003d1);
        local_1c8.n[0] = auVar169._0_8_;
        auVar755._8_8_ = 0;
        auVar755._0_8_ = auVar169._8_8_ * 0x1000 | local_1c8.n[0] >> 0x34;
        auVar154._8_8_ = 0;
        auVar154._0_8_ = uVar808;
        auVar524._8_8_ = 0;
        auVar524._0_8_ = local_188.n[0];
        auVar155._8_8_ = 0;
        auVar155._0_8_ = uVar804;
        auVar525._8_8_ = 0;
        auVar525._0_8_ = local_188.n[1];
        auVar156._8_8_ = 0;
        auVar156._0_8_ = uVar815;
        auVar526._8_8_ = 0;
        auVar526._0_8_ = local_188.n[2];
        local_1c8.n[0] = local_1c8.n[0] & 0xfffffffffffff;
        auVar157._8_8_ = 0;
        auVar157._0_8_ = uVar789;
        auVar527._8_8_ = 0;
        auVar527._0_8_ = local_188.n[3];
        auVar158._8_8_ = 0;
        auVar158._0_8_ = uVar805;
        auVar528._8_8_ = 0;
        auVar528._0_8_ = local_188.n[4];
        auVar784 = auVar156 * auVar526 + auVar158 * auVar528 + auVar157 * auVar527 + auVar784;
        uVar788 = auVar784._0_8_;
        uVar796 = auVar784._8_8_;
        auVar159._8_8_ = 0;
        auVar159._0_8_ = uVar788 & 0xfffffffffffff;
        auVar755 = auVar159 * ZEXT816(0x1000003d10) + auVar154 * auVar524 + auVar155 * auVar525 +
                   auVar755;
        auVar724._8_8_ = uVar796 >> 0x34;
        auVar724._0_8_ = uVar796 * 0x1000 | uVar788 >> 0x34;
        local_1c8.n[1] = auVar755._0_8_ & 0xfffffffffffff;
        auVar160._8_8_ = 0;
        auVar160._0_8_ = uVar805;
        auVar529._8_8_ = 0;
        auVar529._0_8_ = local_188.n[0];
        auVar161._8_8_ = 0;
        auVar161._0_8_ = uVar808;
        auVar530._8_8_ = 0;
        auVar530._0_8_ = local_188.n[1];
        auVar162._8_8_ = 0;
        auVar162._0_8_ = uVar804;
        auVar531._8_8_ = 0;
        auVar531._0_8_ = local_188.n[2];
        auVar163._8_8_ = 0;
        auVar163._0_8_ = uVar815;
        auVar532._8_8_ = 0;
        auVar532._0_8_ = local_188.n[3];
        auVar164._8_8_ = 0;
        auVar164._0_8_ = uVar789;
        auVar533._8_8_ = 0;
        auVar533._0_8_ = local_188.n[4];
        auVar724 = auVar164 * auVar533 + auVar163 * auVar532 + auVar724;
        auVar165._8_8_ = 0;
        auVar165._0_8_ = auVar724._0_8_;
        auVar169 = auVar165 * ZEXT816(0x1000003d10) +
                   auVar160 * auVar529 + auVar162 * auVar531 + auVar161 * auVar530 +
                   (auVar755 >> 0x34);
        auVar170 = auVar169 >> 0x34;
        auVar757._8_8_ = 0;
        auVar757._0_8_ = auVar170._0_8_;
        local_1c8.n[2] = auVar169._0_8_ & 0xfffffffffffff;
        auVar166._8_8_ = 0;
        auVar166._0_8_ = auVar724._8_8_;
        auVar756._8_8_ = auVar170._8_8_;
        auVar756._0_8_ = auVar167._0_8_ & 0xfffffffffffff;
        auVar757 = auVar166 * ZEXT816(0x1000003d10000) + auVar756 + auVar757;
        uVar796 = auVar757._0_8_;
        local_1c8.n[3] = uVar796 & 0xfffffffffffff;
        local_1c8.n[4] =
             (auVar757._8_8_ << 0xc | uVar796 >> 0x34) + (auVar168._0_8_ & 0xffffffffffff);
        iVar787 = secp256k1_fe_impl_is_square_var(&local_1c8);
        if (iVar787 != 0) {
          secp256k1_fe_impl_inv_var(&local_188,&local_188);
          auVar373._8_8_ = 0;
          auVar373._0_8_ = uVar789;
          auVar699._8_8_ = 0;
          auVar699._0_8_ = local_188.n[0];
          auVar374._8_8_ = 0;
          auVar374._0_8_ = uVar805;
          auVar700._8_8_ = 0;
          auVar700._0_8_ = local_188.n[1];
          auVar375._8_8_ = 0;
          auVar375._0_8_ = uVar808;
          auVar701._8_8_ = 0;
          auVar701._0_8_ = local_188.n[2];
          auVar376._8_8_ = 0;
          auVar376._0_8_ = local_188.n[3];
          auVar702._8_8_ = 0;
          auVar702._0_8_ = uVar804;
          auVar377._8_8_ = 0;
          auVar377._0_8_ = local_188.n[4];
          auVar703._8_8_ = 0;
          auVar703._0_8_ = uVar815;
          auVar378._8_8_ = 0;
          auVar378._0_8_ = SUB168(auVar377 * auVar703,0);
          auVar167 = auVar374 * auVar700 + auVar373 * auVar699 + auVar375 * auVar701 +
                     auVar376 * auVar702 + auVar378 * ZEXT816(0x1000003d10);
          local_198 = auVar167._0_8_;
          auVar379._8_8_ = 0;
          auVar379._0_8_ = local_188.n[0];
          auVar704._8_8_ = 0;
          auVar704._0_8_ = uVar815;
          auVar380._8_8_ = 0;
          auVar380._0_8_ = uVar789;
          auVar705._8_8_ = 0;
          auVar705._0_8_ = local_188.n[1];
          auVar381._8_8_ = 0;
          auVar381._0_8_ = uVar805;
          auVar706._8_8_ = 0;
          auVar706._0_8_ = local_188.n[2];
          auVar382._8_8_ = 0;
          auVar382._0_8_ = uVar808;
          auVar707._8_8_ = 0;
          auVar707._0_8_ = local_188.n[3];
          auVar383._8_8_ = 0;
          auVar383._0_8_ = local_188.n[4];
          auVar708._8_8_ = 0;
          auVar708._0_8_ = uVar804;
          auVar384._8_8_ = 0;
          auVar384._0_8_ = SUB168(auVar377 * auVar703,8);
          auVar167 = auVar384 * ZEXT816(0x1000003d10000) +
                     auVar383 * auVar708 +
                     auVar382 * auVar707 +
                     auVar381 * auVar706 + auVar380 * auVar705 + auVar379 * auVar704 +
                     (auVar167 >> 0x34);
          auVar385._8_8_ = 0;
          auVar385._0_8_ = local_188.n[0];
          auVar709._8_8_ = 0;
          auVar709._0_8_ = uVar804;
          auVar386._8_8_ = 0;
          auVar386._0_8_ = local_188.n[1];
          auVar710._8_8_ = 0;
          auVar710._0_8_ = uVar815;
          auVar387._8_8_ = 0;
          auVar387._0_8_ = uVar789;
          auVar711._8_8_ = 0;
          auVar711._0_8_ = local_188.n[2];
          auVar388._8_8_ = 0;
          auVar388._0_8_ = uVar805;
          auVar712._8_8_ = 0;
          auVar712._0_8_ = local_188.n[3];
          auVar389._8_8_ = 0;
          auVar389._0_8_ = uVar808;
          auVar713._8_8_ = 0;
          auVar713._0_8_ = local_188.n[4];
          auVar168 = auVar389 * auVar713 +
                     auVar388 * auVar712 + auVar387 * auVar711 + auVar386 * auVar710 +
                     (auVar167 >> 0x34);
          auVar390._8_8_ = 0;
          auVar390._0_8_ = (auVar168._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar167._6_2_ & 0xf);
          auVar169 = auVar385 * auVar709 + auVar390 * ZEXT816(0x1000003d1);
          uVar796 = auVar169._0_8_;
          uVar788 = auVar169._8_8_;
          auVar391._8_8_ = 0;
          auVar391._0_8_ = uVar808;
          auVar714._8_8_ = 0;
          auVar714._0_8_ = local_188.n[0];
          local_140 = SUB168(auVar391 * auVar714,0);
          auVar392._8_8_ = 0;
          auVar392._0_8_ = local_188.n[1];
          auVar715._8_8_ = 0;
          auVar715._0_8_ = uVar804;
          auVar730._8_8_ = uVar788 >> 0x34;
          auVar730._0_8_ = uVar788 * 0x1000 | uVar796 >> 0x34;
          auVar393._8_8_ = 0;
          auVar393._0_8_ = local_188.n[2];
          auVar716._8_8_ = 0;
          auVar716._0_8_ = uVar815;
          auVar394._8_8_ = 0;
          auVar394._0_8_ = uVar789;
          auVar717._8_8_ = 0;
          auVar717._0_8_ = local_188.n[3];
          auVar395._8_8_ = 0;
          auVar395._0_8_ = uVar805;
          auVar718._8_8_ = 0;
          auVar718._0_8_ = local_188.n[4];
          auVar168 = auVar395 * auVar718 + auVar394 * auVar717 + auVar393 * auVar716 +
                     (auVar168 >> 0x34);
          auVar396._8_8_ = 0;
          auVar396._0_8_ = auVar168._0_8_ & 0xfffffffffffff;
          auVar730 = auVar396 * ZEXT816(0x1000003d10) + auVar391 * auVar714 + auVar392 * auVar715 +
                     auVar730;
          auVar397._8_8_ = 0;
          auVar397._0_8_ = uVar805;
          auVar719._8_8_ = 0;
          auVar719._0_8_ = local_188.n[0];
          auVar398._8_8_ = 0;
          auVar398._0_8_ = uVar808;
          auVar720._8_8_ = 0;
          auVar720._0_8_ = local_188.n[1];
          auVar399._8_8_ = 0;
          auVar399._0_8_ = local_188.n[2];
          auVar721._8_8_ = 0;
          auVar721._0_8_ = uVar804;
          auVar400._8_8_ = 0;
          auVar400._0_8_ = local_188.n[3];
          auVar722._8_8_ = 0;
          auVar722._0_8_ = uVar815;
          auVar401._8_8_ = 0;
          auVar401._0_8_ = uVar789;
          auVar723._8_8_ = 0;
          auVar723._0_8_ = local_188.n[4];
          auVar168 = auVar401 * auVar723 + auVar400 * auVar722 + (auVar168 >> 0x34);
          auVar402._8_8_ = 0;
          auVar402._0_8_ = auVar168._0_8_;
          auVar169 = auVar402 * ZEXT816(0x1000003d10) +
                     auVar399 * auVar721 + auVar398 * auVar720 + auVar397 * auVar719 +
                     (auVar730 >> 0x34);
          auVar170 = auVar169 >> 0x34;
          auVar782._8_8_ = 0;
          auVar782._0_8_ = auVar170._0_8_;
          local_188.n[2] = auVar169._0_8_ & 0xfffffffffffff;
          auVar403._8_8_ = 0;
          auVar403._0_8_ = auVar168._8_8_;
          auVar781._8_8_ = auVar170._8_8_;
          auVar781._0_8_ = local_198 & 0xfffffffffffff;
          auVar782 = auVar403 * ZEXT816(0x1000003d10000) + auVar781 + auVar782;
          uVar804 = auVar782._0_8_;
          local_188.n[3] = uVar804 & 0xfffffffffffff;
          local_188.n[4] =
               (auVar782._8_8_ << 0xc | uVar804 >> 0x34) + (auVar167._0_8_ & 0xffffffffffff);
          local_188.n[0] = uVar796 & 0xfffffffffffff;
          local_188.n[1] = auVar730._0_8_ & 0xfffffffffffff;
          local_130.n[0] = uVar807;
          local_130.n[1] = uVar814;
          local_130.n[2] = uVar809;
          local_130.n[3] = uVar806;
          local_130.n[4] = uVar802;
LAB_00237637:
          secp256k1_fe_sqrt(&local_1c8,&local_188);
          r_00 = local_108;
          if (((local_18c & 5) == 5) || ((local_18c & 5) == 0)) {
            local_1c8.n[0] = 0x3ffffbfffff0bc - local_1c8.n[0];
            local_1c8.n[1] = 0x3ffffffffffffc - local_1c8.n[1];
            local_1c8.n[2] = 0x3ffffffffffffc - local_1c8.n[2];
            local_1c8.n[3] = 0x3ffffffffffffc - local_1c8.n[3];
            local_1c8.n[4] = 0x3fffffffffffc - local_1c8.n[4];
          }
          bVar816 = (local_18c & 1) == 0;
          uVar802 = 0xf8ef919bb8615;
          if (bVar816) {
            uVar802 = 0x7106e64479ea;
          }
          uVar806 = 0x3cbcb16630fb6;
          if (bVar816) {
            uVar806 = 0xc3434e99cf049;
          }
          uVar807 = 0x8aed0a766a3ec;
          if (bVar816) {
            uVar807 = 0x7512f58995c13;
          }
          uVar809 = 0x693d68e6afa41;
          if (bVar816) {
            uVar809 = 0x96c28719501ef;
          }
          uVar814 = 0x851695d49a83;
          if (bVar816) {
            uVar814 = 0x7ae96a2b657c;
          }
          auVar311._8_8_ = 0;
          auVar311._0_8_ = uVar802;
          auVar649._8_8_ = 0;
          auVar649._0_8_ = uVar798;
          auVar312._8_8_ = 0;
          auVar312._0_8_ = uVar806;
          auVar650._8_8_ = 0;
          auVar650._0_8_ = uVar795;
          auVar313._8_8_ = 0;
          auVar313._0_8_ = uVar807;
          auVar651._8_8_ = 0;
          auVar651._0_8_ = uVar794;
          auVar314._8_8_ = 0;
          auVar314._0_8_ = uVar809;
          auVar652._8_8_ = 0;
          auVar652._0_8_ = uVar793;
          auVar315._8_8_ = 0;
          auVar315._0_8_ = uVar814;
          auVar653._8_8_ = 0;
          auVar653._0_8_ = uVar803;
          auVar316._8_8_ = 0;
          auVar316._0_8_ = SUB168(auVar315 * auVar653,0);
          auVar169 = auVar312 * auVar650 + auVar311 * auVar649 + auVar313 * auVar651 +
                     auVar314 * auVar652 + auVar316 * ZEXT816(0x1000003d10);
          auVar317._8_8_ = 0;
          auVar317._0_8_ = uVar814;
          auVar654._8_8_ = 0;
          auVar654._0_8_ = uVar798;
          auVar318._8_8_ = 0;
          auVar318._0_8_ = uVar802;
          auVar655._8_8_ = 0;
          auVar655._0_8_ = uVar795;
          auVar319._8_8_ = 0;
          auVar319._0_8_ = uVar806;
          auVar656._8_8_ = 0;
          auVar656._0_8_ = uVar794;
          auVar320._8_8_ = 0;
          auVar320._0_8_ = uVar807;
          auVar657._8_8_ = 0;
          auVar657._0_8_ = uVar793;
          auVar321._8_8_ = 0;
          auVar321._0_8_ = uVar809;
          auVar658._8_8_ = 0;
          auVar658._0_8_ = uVar803;
          auVar322._8_8_ = 0;
          auVar322._0_8_ = SUB168(auVar315 * auVar653,8);
          auVar167 = auVar322 * ZEXT816(0x1000003d10000) +
                     auVar321 * auVar658 +
                     auVar320 * auVar657 +
                     auVar319 * auVar656 + auVar318 * auVar655 + auVar317 * auVar654 +
                     (auVar169 >> 0x34);
          auVar323._8_8_ = 0;
          auVar323._0_8_ = uVar809;
          auVar659._8_8_ = 0;
          auVar659._0_8_ = uVar798;
          auVar324._8_8_ = 0;
          auVar324._0_8_ = uVar814;
          auVar660._8_8_ = 0;
          auVar660._0_8_ = uVar795;
          auVar325._8_8_ = 0;
          auVar325._0_8_ = uVar802;
          auVar661._8_8_ = 0;
          auVar661._0_8_ = uVar794;
          auVar326._8_8_ = 0;
          auVar326._0_8_ = uVar806;
          auVar662._8_8_ = 0;
          auVar662._0_8_ = uVar793;
          auVar327._8_8_ = 0;
          auVar327._0_8_ = uVar807;
          auVar663._8_8_ = 0;
          auVar663._0_8_ = uVar803;
          auVar168 = auVar327 * auVar663 +
                     auVar324 * auVar660 + auVar325 * auVar661 + auVar326 * auVar662 +
                     (auVar167 >> 0x34);
          auVar328._8_8_ = 0;
          auVar328._0_8_ = (auVar168._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar167._6_2_ & 0xf);
          auVar170 = auVar328 * ZEXT816(0x1000003d1) + auVar323 * auVar659;
          uVar804 = auVar170._0_8_;
          auVar774._8_8_ = 0;
          auVar774._0_8_ = auVar170._8_8_ * 0x1000 | uVar804 >> 0x34;
          auVar329._8_8_ = 0;
          auVar329._0_8_ = uVar807;
          auVar664._8_8_ = 0;
          auVar664._0_8_ = uVar798;
          auVar330._8_8_ = 0;
          auVar330._0_8_ = uVar809;
          auVar665._8_8_ = 0;
          auVar665._0_8_ = uVar795;
          auVar331._8_8_ = 0;
          auVar331._0_8_ = uVar814;
          auVar666._8_8_ = 0;
          auVar666._0_8_ = uVar794;
          auVar332._8_8_ = 0;
          auVar332._0_8_ = uVar802;
          auVar667._8_8_ = 0;
          auVar667._0_8_ = uVar793;
          auVar333._8_8_ = 0;
          auVar333._0_8_ = uVar806;
          auVar668._8_8_ = 0;
          auVar668._0_8_ = uVar803;
          auVar168 = auVar333 * auVar668 + auVar332 * auVar667 + auVar331 * auVar666 +
                     (auVar168 >> 0x34);
          uVar796 = auVar168._0_8_;
          auVar775._8_8_ = 0;
          auVar775._0_8_ = auVar168._8_8_ << 0xc | uVar796 >> 0x34;
          auVar334._8_8_ = 0;
          auVar334._0_8_ = uVar796 & 0xfffffffffffff;
          auVar774 = auVar334 * ZEXT816(0x1000003d10) + auVar330 * auVar665 + auVar329 * auVar664 +
                     auVar774;
          uVar796 = auVar774._0_8_;
          auVar776._8_8_ = 0;
          auVar776._0_8_ = auVar774._8_8_ << 0xc | uVar796 >> 0x34;
          auVar335._8_8_ = 0;
          auVar335._0_8_ = uVar806;
          auVar669._8_8_ = 0;
          auVar669._0_8_ = uVar798;
          auVar336._8_8_ = 0;
          auVar336._0_8_ = uVar807;
          auVar670._8_8_ = 0;
          auVar670._0_8_ = uVar795;
          auVar337._8_8_ = 0;
          auVar337._0_8_ = uVar809;
          auVar671._8_8_ = 0;
          auVar671._0_8_ = uVar794;
          auVar338._8_8_ = 0;
          auVar338._0_8_ = uVar814;
          auVar672._8_8_ = 0;
          auVar672._0_8_ = uVar793;
          auVar339._8_8_ = 0;
          auVar339._0_8_ = uVar802;
          auVar673._8_8_ = 0;
          auVar673._0_8_ = uVar803;
          auVar775 = auVar338 * auVar672 + auVar339 * auVar673 + auVar775;
          auVar340._8_8_ = 0;
          auVar340._0_8_ = auVar775._0_8_;
          auVar776 = auVar340 * ZEXT816(0x1000003d10) +
                     auVar337 * auVar671 + auVar336 * auVar670 + auVar335 * auVar669 + auVar776;
          auVar168 = auVar776 >> 0x34;
          auVar778._8_8_ = 0;
          auVar778._0_8_ = auVar168._0_8_;
          auVar341._8_8_ = 0;
          auVar341._0_8_ = auVar775._8_8_;
          auVar777._8_8_ = auVar168._8_8_;
          auVar777._0_8_ = auVar169._0_8_ & 0xfffffffffffff;
          auVar778 = auVar341 * ZEXT816(0x1000003d10000) + auVar777 + auVar778;
          uVar802 = auVar778._0_8_;
          uVar793 = (uVar804 & 0xfffffffffffff) + local_130.n[0];
          uVar798 = (uVar796 & 0xfffffffffffff) + local_130.n[1];
          uVar795 = (auVar776._0_8_ & 0xfffffffffffff) + local_130.n[2];
          uVar803 = (uVar802 & 0xfffffffffffff) + local_130.n[3];
          uVar794 = (auVar778._8_8_ << 0xc | uVar802 >> 0x34) + (auVar167._0_8_ & 0xffffffffffff) +
                    local_130.n[4];
          auVar342._8_8_ = 0;
          auVar342._0_8_ = local_1c8.n[0];
          auVar674._8_8_ = 0;
          auVar674._0_8_ = uVar803;
          auVar343._8_8_ = 0;
          auVar343._0_8_ = local_1c8.n[1];
          auVar675._8_8_ = 0;
          auVar675._0_8_ = uVar795;
          auVar344._8_8_ = 0;
          auVar344._0_8_ = local_1c8.n[2];
          auVar676._8_8_ = 0;
          auVar676._0_8_ = uVar798;
          auVar345._8_8_ = 0;
          auVar345._0_8_ = local_1c8.n[3];
          auVar677._8_8_ = 0;
          auVar677._0_8_ = uVar793;
          auVar346._8_8_ = 0;
          auVar346._0_8_ = local_1c8.n[4];
          auVar678._8_8_ = 0;
          auVar678._0_8_ = uVar794;
          auVar347._8_8_ = 0;
          auVar347._0_8_ = SUB168(auVar346 * auVar678,0);
          auVar169 = auVar343 * auVar675 + auVar342 * auVar674 + auVar344 * auVar676 +
                     auVar345 * auVar677 + auVar347 * ZEXT816(0x1000003d10);
          auVar348._8_8_ = 0;
          auVar348._0_8_ = uVar794;
          auVar679._8_8_ = 0;
          auVar679._0_8_ = local_1c8.n[0];
          auVar349._8_8_ = 0;
          auVar349._0_8_ = local_1c8.n[1];
          auVar680._8_8_ = 0;
          auVar680._0_8_ = uVar803;
          auVar350._8_8_ = 0;
          auVar350._0_8_ = local_1c8.n[2];
          auVar681._8_8_ = 0;
          auVar681._0_8_ = uVar795;
          auVar351._8_8_ = 0;
          auVar351._0_8_ = local_1c8.n[3];
          auVar682._8_8_ = 0;
          auVar682._0_8_ = uVar798;
          auVar352._8_8_ = 0;
          auVar352._0_8_ = local_1c8.n[4];
          auVar683._8_8_ = 0;
          auVar683._0_8_ = uVar793;
          auVar353._8_8_ = 0;
          auVar353._0_8_ = SUB168(auVar346 * auVar678,8);
          auVar167 = auVar353 * ZEXT816(0x1000003d10000) +
                     auVar352 * auVar683 +
                     auVar351 * auVar682 +
                     auVar350 * auVar681 + auVar349 * auVar680 + auVar348 * auVar679 +
                     (auVar169 >> 0x34);
          auVar354._8_8_ = 0;
          auVar354._0_8_ = local_1c8.n[0];
          auVar684._8_8_ = 0;
          auVar684._0_8_ = uVar793;
          auVar355._8_8_ = 0;
          auVar355._0_8_ = local_1c8.n[1];
          auVar685._8_8_ = 0;
          auVar685._0_8_ = uVar794;
          auVar356._8_8_ = 0;
          auVar356._0_8_ = local_1c8.n[2];
          auVar686._8_8_ = 0;
          auVar686._0_8_ = uVar803;
          auVar357._8_8_ = 0;
          auVar357._0_8_ = local_1c8.n[3];
          auVar687._8_8_ = 0;
          auVar687._0_8_ = uVar795;
          auVar358._8_8_ = 0;
          auVar358._0_8_ = local_1c8.n[4];
          auVar688._8_8_ = 0;
          auVar688._0_8_ = uVar798;
          auVar168 = auVar358 * auVar688 +
                     auVar357 * auVar687 + auVar356 * auVar686 + auVar355 * auVar685 +
                     (auVar167 >> 0x34);
          auVar359._8_8_ = 0;
          auVar359._0_8_ = (auVar168._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar167._6_2_ & 0xf);
          auVar170 = auVar359 * ZEXT816(0x1000003d1) + auVar354 * auVar684;
          uVar802 = auVar170._0_8_;
          uVar806 = auVar170._8_8_;
          auVar360._8_8_ = 0;
          auVar360._0_8_ = local_1c8.n[0];
          auVar689._8_8_ = 0;
          auVar689._0_8_ = uVar798;
          auVar361._8_8_ = 0;
          auVar361._0_8_ = local_1c8.n[1];
          auVar690._8_8_ = 0;
          auVar690._0_8_ = uVar793;
          auVar728._8_8_ = uVar806 >> 0x34;
          auVar728._0_8_ = uVar806 * 0x1000 | uVar802 >> 0x34;
          auVar362._8_8_ = 0;
          auVar362._0_8_ = local_1c8.n[2];
          auVar691._8_8_ = 0;
          auVar691._0_8_ = uVar794;
          auVar363._8_8_ = 0;
          auVar363._0_8_ = local_1c8.n[3];
          auVar692._8_8_ = 0;
          auVar692._0_8_ = uVar803;
          auVar364._8_8_ = 0;
          auVar364._0_8_ = local_1c8.n[4];
          auVar693._8_8_ = 0;
          auVar693._0_8_ = uVar795;
          auVar168 = auVar364 * auVar693 + auVar363 * auVar692 + auVar362 * auVar691 +
                     (auVar168 >> 0x34);
          uVar806 = auVar168._0_8_;
          uVar807 = auVar168._8_8_;
          auVar365._8_8_ = 0;
          auVar365._0_8_ = uVar806 & 0xfffffffffffff;
          auVar728 = auVar365 * ZEXT816(0x1000003d10) + auVar361 * auVar690 + auVar360 * auVar689 +
                     auVar728;
          auVar729._8_8_ = uVar807 >> 0x34;
          auVar729._0_8_ = uVar807 * 0x1000 | uVar806 >> 0x34;
          auVar366._8_8_ = 0;
          auVar366._0_8_ = local_1c8.n[0];
          auVar694._8_8_ = 0;
          auVar694._0_8_ = uVar795;
          auVar367._8_8_ = 0;
          auVar367._0_8_ = local_1c8.n[1];
          auVar695._8_8_ = 0;
          auVar695._0_8_ = uVar798;
          auVar368._8_8_ = 0;
          auVar368._0_8_ = local_1c8.n[2];
          auVar696._8_8_ = 0;
          auVar696._0_8_ = uVar793;
          auVar369._8_8_ = 0;
          auVar369._0_8_ = local_1c8.n[3];
          auVar697._8_8_ = 0;
          auVar697._0_8_ = uVar794;
          auVar370._8_8_ = 0;
          auVar370._0_8_ = local_1c8.n[4];
          auVar698._8_8_ = 0;
          auVar698._0_8_ = uVar803;
          auVar729 = auVar370 * auVar698 + auVar369 * auVar697 + auVar729;
          local_108->n[0] = uVar802 & 0xfffffffffffff;
          auVar371._8_8_ = 0;
          auVar371._0_8_ = auVar729._0_8_;
          local_108->n[1] = auVar728._0_8_ & 0xfffffffffffff;
          auVar168 = auVar371 * ZEXT816(0x1000003d10) +
                     auVar368 * auVar696 + auVar367 * auVar695 + auVar366 * auVar694 +
                     (auVar728 >> 0x34);
          auVar170 = auVar168 >> 0x34;
          auVar780._8_8_ = 0;
          auVar780._0_8_ = auVar170._0_8_;
          local_108->n[2] = auVar168._0_8_ & 0xfffffffffffff;
          auVar372._8_8_ = 0;
          auVar372._0_8_ = auVar729._8_8_;
          auVar779._8_8_ = auVar170._8_8_;
          auVar779._0_8_ = auVar169._0_8_ & 0xfffffffffffff;
          auVar780 = auVar372 * ZEXT816(0x1000003d10000) + auVar779 + auVar780;
          uVar802 = auVar780._0_8_;
          local_108->n[3] = uVar802 & 0xfffffffffffff;
          local_108->n[4] =
               (auVar780._8_8_ << 0xc | uVar802 >> 0x34) + (auVar167._0_8_ & 0xffffffffffff);
          secp256k1_fe_impl_normalize_var(local_108);
          if ((((uint)(local_138->y).n[0] ^ (uint)r_00->n[0]) & 1) == 0) {
            return;
          }
          r_00->n[0] = 0x3ffffbfffff0bc - r_00->n[0];
          r_00->n[1] = 0x3ffffffffffffc - r_00->n[1];
          r_00->n[2] = 0x3ffffffffffffc - r_00->n[2];
          r_00->n[3] = 0x3ffffffffffffc - r_00->n[3];
          r_00->n[4] = 0x3fffffffffffc - r_00->n[4];
          secp256k1_fe_impl_normalize_var(r_00);
          return;
        }
      }
    }
    else {
      uVar804 = 0x3ffffbfffff0bc - uVar798;
      uVar788 = 0x3ffffffffffffc - uVar795;
      uVar789 = 0x3ffffffffffffc - uVar794;
      uVar796 = 0x3ffffffffffffc - uVar793;
      uVar805 = 0x3fffffffffffc - uVar803;
      uVar807 = uVar807 + uVar804;
      uVar814 = uVar814 + uVar788;
      uVar809 = uVar809 + uVar789;
      uVar806 = uVar806 + uVar796;
      uVar802 = uVar802 + uVar805;
      local_1c8.n[0] = uVar804;
      local_1c8.n[1] = uVar788;
      local_1c8.n[2] = uVar789;
      local_1c8.n[3] = uVar796;
      local_1c8.n[4] = uVar805;
      local_188.n[0] = uVar807;
      local_188.n[1] = uVar814;
      local_188.n[2] = uVar809;
      local_188.n[3] = uVar806;
      local_188.n[4] = uVar802;
      iVar787 = secp256k1_fe_impl_is_square_var(&local_188);
      if (iVar787 != 0) {
        uVar808 = uVar798 * 2;
        auVar167._8_8_ = 0;
        auVar167._0_8_ = uVar793;
        auVar534._8_8_ = 0;
        auVar534._0_8_ = uVar808;
        auVar168._8_8_ = 0;
        auVar168._0_8_ = uVar794;
        auVar535._8_8_ = 0;
        auVar535._0_8_ = uVar795 * 2;
        auVar169._8_8_ = 0;
        auVar169._0_8_ = uVar803;
        auVar536._8_8_ = 0;
        auVar536._0_8_ = uVar803;
        auVar170._8_8_ = 0;
        auVar170._0_8_ = SUB168(auVar169 * auVar536,0);
        auVar167 = auVar170 * ZEXT816(0x1000003d10) + auVar168 * auVar535 + auVar167 * auVar534;
        uVar811 = auVar167._0_8_;
        auVar758._8_8_ = 0;
        auVar758._0_8_ = auVar167._8_8_ << 0xc | uVar811 >> 0x34;
        uVar815 = uVar803 * 2;
        auVar171._8_8_ = 0;
        auVar171._0_8_ = uVar815;
        auVar537._8_8_ = 0;
        auVar537._0_8_ = uVar798;
        auVar172._8_8_ = 0;
        auVar172._0_8_ = uVar793;
        auVar538._8_8_ = 0;
        auVar538._0_8_ = uVar795 * 2;
        auVar173._8_8_ = 0;
        auVar173._0_8_ = uVar794;
        auVar539._8_8_ = 0;
        auVar539._0_8_ = uVar794;
        auVar174._8_8_ = 0;
        auVar174._0_8_ = SUB168(auVar169 * auVar536,8);
        auVar758 = auVar174 * ZEXT816(0x1000003d10000) +
                   auVar171 * auVar537 + auVar173 * auVar539 + auVar172 * auVar538 + auVar758;
        auVar175._8_8_ = 0;
        auVar175._0_8_ = uVar798;
        auVar540._8_8_ = 0;
        auVar540._0_8_ = uVar798;
        auVar176._8_8_ = 0;
        auVar176._0_8_ = uVar815;
        auVar541._8_8_ = 0;
        auVar541._0_8_ = uVar795;
        auVar177._8_8_ = 0;
        auVar177._0_8_ = uVar793;
        auVar542._8_8_ = 0;
        auVar542._0_8_ = uVar794 * 2;
        auVar167 = auVar177 * auVar542 + auVar176 * auVar541 + (auVar758 >> 0x34);
        uVar790 = auVar167._0_8_;
        auVar759._8_8_ = 0;
        auVar759._0_8_ = auVar167._8_8_ << 0xc | uVar790 >> 0x34;
        auVar178._8_8_ = 0;
        auVar178._0_8_ = (uVar790 & 0xfffffffffffff) << 4 | (ulong)(auVar758._6_2_ & 0xf);
        auVar167 = auVar178 * ZEXT816(0x1000003d1) + auVar175 * auVar540;
        uVar791 = auVar167._0_8_;
        auVar760._8_8_ = 0;
        auVar760._0_8_ = auVar167._8_8_ << 0xc | uVar791 >> 0x34;
        auVar179._8_8_ = 0;
        auVar179._0_8_ = uVar795;
        auVar543._8_8_ = 0;
        auVar543._0_8_ = uVar808;
        auVar180._8_8_ = 0;
        auVar180._0_8_ = uVar815;
        auVar544._8_8_ = 0;
        auVar544._0_8_ = uVar794;
        auVar181._8_8_ = 0;
        auVar181._0_8_ = uVar793;
        auVar545._8_8_ = 0;
        auVar545._0_8_ = uVar793;
        auVar759 = auVar181 * auVar545 + auVar180 * auVar544 + auVar759;
        uVar790 = auVar759._0_8_;
        auVar761._8_8_ = 0;
        auVar761._0_8_ = auVar759._8_8_ << 0xc | uVar790 >> 0x34;
        auVar182._8_8_ = 0;
        auVar182._0_8_ = uVar790 & 0xfffffffffffff;
        auVar760 = auVar182 * ZEXT816(0x1000003d10) + auVar179 * auVar543 + auVar760;
        uVar812 = auVar760._0_8_;
        auVar762._8_8_ = 0;
        auVar762._0_8_ = auVar760._8_8_ << 0xc | uVar812 >> 0x34;
        auVar183._8_8_ = 0;
        auVar183._0_8_ = uVar794;
        auVar546._8_8_ = 0;
        auVar546._0_8_ = uVar808;
        auVar184._8_8_ = 0;
        auVar184._0_8_ = uVar795;
        auVar547._8_8_ = 0;
        auVar547._0_8_ = uVar795;
        auVar185._8_8_ = 0;
        auVar185._0_8_ = uVar815;
        auVar548._8_8_ = 0;
        auVar548._0_8_ = uVar793;
        auVar761 = auVar185 * auVar548 + auVar761;
        auVar186._8_8_ = 0;
        auVar186._0_8_ = auVar761._0_8_;
        auVar762 = auVar186 * ZEXT816(0x1000003d10) + auVar184 * auVar547 + auVar183 * auVar546 +
                   auVar762;
        auVar167 = auVar762 >> 0x34;
        auVar764._8_8_ = 0;
        auVar764._0_8_ = auVar167._0_8_;
        auVar187._8_8_ = 0;
        auVar187._0_8_ = auVar761._8_8_;
        auVar763._8_8_ = auVar167._8_8_;
        auVar763._0_8_ = uVar811 & 0xffffffffffffe;
        auVar764 = auVar187 * ZEXT816(0x1000003d10000) + auVar763 + auVar764;
        uVar808 = auVar764._0_8_;
        uVar810 = uVar808 & 0xfffffffffffff;
        auVar188._8_8_ = 0;
        auVar188._0_8_ = uVar810;
        auVar549._8_8_ = 0;
        auVar549._0_8_ = uVar807;
        uVar799 = (auVar764._8_8_ << 0xc | uVar808 >> 0x34) + (auVar758._0_8_ & 0xffffffffffff);
        uVar811 = auVar762._0_8_ & 0xfffffffffffff;
        auVar189._8_8_ = 0;
        auVar189._0_8_ = uVar811;
        auVar550._8_8_ = 0;
        auVar550._0_8_ = uVar814;
        uVar812 = uVar812 & 0xfffffffffffff;
        auVar190._8_8_ = 0;
        auVar190._0_8_ = uVar812;
        auVar551._8_8_ = 0;
        auVar551._0_8_ = uVar809;
        uVar791 = uVar791 & 0xfffffffffffff;
        auVar191._8_8_ = 0;
        auVar191._0_8_ = uVar791;
        auVar552._8_8_ = 0;
        auVar552._0_8_ = uVar806;
        auVar192._8_8_ = 0;
        auVar192._0_8_ = uVar802;
        auVar553._8_8_ = 0;
        auVar553._0_8_ = uVar799;
        auVar193._8_8_ = 0;
        auVar193._0_8_ = SUB168(auVar192 * auVar553,0);
        auVar170 = auVar189 * auVar550 + auVar188 * auVar549 + auVar190 * auVar551 +
                   auVar191 * auVar552 + auVar193 * ZEXT816(0x1000003d10);
        auVar194._8_8_ = 0;
        auVar194._0_8_ = uVar807;
        auVar554._8_8_ = 0;
        auVar554._0_8_ = uVar799;
        auVar195._8_8_ = 0;
        auVar195._0_8_ = uVar810;
        auVar555._8_8_ = 0;
        auVar555._0_8_ = uVar814;
        auVar196._8_8_ = 0;
        auVar196._0_8_ = uVar811;
        auVar556._8_8_ = 0;
        auVar556._0_8_ = uVar809;
        auVar197._8_8_ = 0;
        auVar197._0_8_ = uVar812;
        auVar557._8_8_ = 0;
        auVar557._0_8_ = uVar806;
        auVar198._8_8_ = 0;
        auVar198._0_8_ = uVar791;
        auVar558._8_8_ = 0;
        auVar558._0_8_ = uVar802;
        auVar199._8_8_ = 0;
        auVar199._0_8_ = SUB168(auVar192 * auVar553,8);
        auVar167 = auVar199 * ZEXT816(0x1000003d10000) +
                   auVar198 * auVar558 +
                   auVar197 * auVar557 +
                   auVar196 * auVar556 + auVar195 * auVar555 + auVar194 * auVar554 +
                   (auVar170 >> 0x34);
        auVar200._8_8_ = 0;
        auVar200._0_8_ = uVar791;
        auVar559._8_8_ = 0;
        auVar559._0_8_ = uVar807;
        auVar201._8_8_ = 0;
        auVar201._0_8_ = uVar814;
        auVar560._8_8_ = 0;
        auVar560._0_8_ = uVar799;
        auVar202._8_8_ = 0;
        auVar202._0_8_ = uVar810;
        auVar561._8_8_ = 0;
        auVar561._0_8_ = uVar809;
        auVar203._8_8_ = 0;
        auVar203._0_8_ = uVar811;
        auVar562._8_8_ = 0;
        auVar562._0_8_ = uVar806;
        auVar204._8_8_ = 0;
        auVar204._0_8_ = uVar812;
        auVar563._8_8_ = 0;
        auVar563._0_8_ = uVar802;
        auVar168 = auVar204 * auVar563 +
                   auVar203 * auVar562 + auVar202 * auVar561 + auVar201 * auVar560 +
                   (auVar167 >> 0x34);
        auVar205._8_8_ = 0;
        auVar205._0_8_ = (auVar168._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar167._6_2_ & 0xf);
        auVar169 = auVar205 * ZEXT816(0x1000003d1) + auVar200 * auVar559;
        uVar808 = auVar169._0_8_;
        uVar815 = auVar169._8_8_;
        auVar725._8_8_ = uVar815 >> 0x34;
        auVar725._0_8_ = uVar815 * 0x1000 | uVar808 >> 0x34;
        auVar206._8_8_ = 0;
        auVar206._0_8_ = uVar812;
        auVar564._8_8_ = 0;
        auVar564._0_8_ = uVar807;
        auVar207._8_8_ = 0;
        auVar207._0_8_ = uVar791;
        auVar565._8_8_ = 0;
        auVar565._0_8_ = uVar814;
        auVar208._8_8_ = 0;
        auVar208._0_8_ = uVar809;
        auVar566._8_8_ = 0;
        auVar566._0_8_ = uVar799;
        auVar209._8_8_ = 0;
        auVar209._0_8_ = uVar810;
        auVar567._8_8_ = 0;
        auVar567._0_8_ = uVar806;
        auVar210._8_8_ = 0;
        auVar210._0_8_ = uVar811;
        auVar568._8_8_ = 0;
        auVar568._0_8_ = uVar802;
        auVar168 = auVar210 * auVar568 + auVar209 * auVar567 + auVar208 * auVar566 +
                   (auVar168 >> 0x34);
        auVar211._8_8_ = 0;
        auVar211._0_8_ = auVar168._0_8_ & 0xfffffffffffff;
        auVar725 = auVar211 * ZEXT816(0x1000003d10) + auVar207 * auVar565 + auVar206 * auVar564 +
                   auVar725;
        auVar212._8_8_ = 0;
        auVar212._0_8_ = uVar811;
        auVar569._8_8_ = 0;
        auVar569._0_8_ = uVar807;
        auVar213._8_8_ = 0;
        auVar213._0_8_ = uVar812;
        auVar570._8_8_ = 0;
        auVar570._0_8_ = uVar814;
        auVar214._8_8_ = 0;
        auVar214._0_8_ = uVar791;
        auVar571._8_8_ = 0;
        auVar571._0_8_ = uVar809;
        auVar215._8_8_ = 0;
        auVar215._0_8_ = uVar806;
        auVar572._8_8_ = 0;
        auVar572._0_8_ = uVar799;
        auVar216._8_8_ = 0;
        auVar216._0_8_ = uVar810;
        auVar573._8_8_ = 0;
        auVar573._0_8_ = uVar802;
        auVar168 = auVar216 * auVar573 + auVar215 * auVar572 + (auVar168 >> 0x34);
        auVar217._8_8_ = 0;
        auVar217._0_8_ = auVar168._0_8_;
        auVar169 = auVar217 * ZEXT816(0x1000003d10) +
                   auVar214 * auVar571 + auVar213 * auVar570 + auVar212 * auVar569 +
                   (auVar725 >> 0x34);
        auVar171 = auVar169 >> 0x34;
        auVar766._8_8_ = 0;
        auVar766._0_8_ = auVar171._0_8_;
        auVar218._8_8_ = 0;
        auVar218._0_8_ = auVar168._8_8_;
        local_1a0 = auVar169._0_8_ & 0xfffffffffffff;
        auVar765._8_8_ = auVar171._8_8_;
        auVar765._0_8_ = auVar170._0_8_ & 0xfffffffffffff;
        auVar766 = auVar218 * ZEXT816(0x1000003d10000) + auVar765 + auVar766;
        uVar790 = auVar766._0_8_;
        local_148 = (auVar766._8_8_ << 0xc | uVar790 >> 0x34) + (auVar167._0_8_ & 0xffffffffffff);
        auVar219._8_8_ = 0;
        auVar219._0_8_ = uVar791;
        auVar574._8_8_ = 0;
        auVar574._0_8_ = uVar793;
        auVar220._8_8_ = 0;
        auVar220._0_8_ = uVar812;
        auVar575._8_8_ = 0;
        auVar575._0_8_ = uVar794;
        auVar221._8_8_ = 0;
        auVar221._0_8_ = uVar811;
        auVar576._8_8_ = 0;
        auVar576._0_8_ = uVar795;
        auVar222._8_8_ = 0;
        auVar222._0_8_ = uVar810;
        auVar577._8_8_ = 0;
        auVar577._0_8_ = uVar798;
        auVar223._8_8_ = 0;
        auVar223._0_8_ = uVar799;
        auVar578._8_8_ = 0;
        auVar578._0_8_ = uVar803;
        auVar224._8_8_ = 0;
        auVar224._0_8_ = SUB168(auVar223 * auVar578,0);
        auVar167 = auVar220 * auVar575 + auVar219 * auVar574 + auVar221 * auVar576 +
                   auVar222 * auVar577 + auVar224 * ZEXT816(0x1000003d10);
        local_100 = auVar167._0_8_;
        auVar225._8_8_ = 0;
        auVar225._0_8_ = uVar791;
        auVar579._8_8_ = 0;
        auVar579._0_8_ = uVar803;
        auVar226._8_8_ = 0;
        auVar226._0_8_ = uVar812;
        auVar580._8_8_ = 0;
        auVar580._0_8_ = uVar793;
        auVar227._8_8_ = 0;
        auVar227._0_8_ = uVar811;
        auVar581._8_8_ = 0;
        auVar581._0_8_ = uVar794;
        auVar228._8_8_ = 0;
        auVar228._0_8_ = uVar810;
        auVar582._8_8_ = 0;
        auVar582._0_8_ = uVar795;
        auVar229._8_8_ = 0;
        auVar229._0_8_ = uVar799;
        auVar583._8_8_ = 0;
        auVar583._0_8_ = uVar798;
        auVar230._8_8_ = 0;
        auVar230._0_8_ = SUB168(auVar223 * auVar578,8);
        auVar167 = auVar230 * ZEXT816(0x1000003d10000) +
                   auVar229 * auVar583 +
                   auVar228 * auVar582 +
                   auVar227 * auVar581 + auVar226 * auVar580 + auVar225 * auVar579 +
                   (auVar167 >> 0x34);
        auVar231._8_8_ = 0;
        auVar231._0_8_ = uVar791;
        auVar584._8_8_ = 0;
        auVar584._0_8_ = uVar798;
        auVar232._8_8_ = 0;
        auVar232._0_8_ = uVar812;
        auVar585._8_8_ = 0;
        auVar585._0_8_ = uVar803;
        auVar233._8_8_ = 0;
        auVar233._0_8_ = uVar811;
        auVar586._8_8_ = 0;
        auVar586._0_8_ = uVar793;
        auVar234._8_8_ = 0;
        auVar234._0_8_ = uVar810;
        auVar587._8_8_ = 0;
        auVar587._0_8_ = uVar794;
        auVar235._8_8_ = 0;
        auVar235._0_8_ = uVar799;
        auVar588._8_8_ = 0;
        auVar588._0_8_ = uVar795;
        auVar168 = auVar235 * auVar588 +
                   auVar234 * auVar587 + auVar233 * auVar586 + auVar232 * auVar585 +
                   (auVar167 >> 0x34);
        auVar236._8_8_ = 0;
        auVar236._0_8_ = (auVar168._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar167._6_2_ & 0xf);
        auVar169 = auVar236 * ZEXT816(0x1000003d1) + auVar231 * auVar584;
        uVar815 = auVar169._0_8_;
        local_158._8_8_ = 0;
        local_158._0_8_ = uVar791;
        auVar589._8_8_ = 0;
        auVar589._0_8_ = uVar795;
        local_158 = local_158 * auVar589;
        auVar237._8_8_ = 0;
        auVar237._0_8_ = uVar812;
        auVar590._8_8_ = 0;
        auVar590._0_8_ = uVar798;
        auVar238._8_8_ = 0;
        auVar238._0_8_ = uVar811;
        auVar591._8_8_ = 0;
        auVar591._0_8_ = uVar803;
        auVar239._8_8_ = 0;
        auVar239._0_8_ = uVar810;
        auVar592._8_8_ = 0;
        auVar592._0_8_ = uVar793;
        auVar240._8_8_ = 0;
        auVar240._0_8_ = uVar799;
        auVar593._8_8_ = 0;
        auVar593._0_8_ = uVar794;
        auVar168 = auVar240 * auVar593 + auVar239 * auVar592 + auVar238 * auVar591 +
                   (auVar168 >> 0x34);
        auVar241._8_8_ = 0;
        auVar241._0_8_ = auVar168._0_8_ & 0xfffffffffffff;
        auVar785._8_8_ = 0;
        auVar785._0_8_ = auVar169._8_8_ * 0x1000 | uVar815 >> 0x34;
        auVar785 = auVar241 * ZEXT816(0x1000003d10) + auVar237 * auVar590 + local_158 + auVar785;
        uVar800 = auVar785._0_8_;
        auVar767._8_8_ = 0;
        auVar767._0_8_ = auVar785._8_8_ * 0x1000 | uVar800 >> 0x34;
        auVar242._8_8_ = 0;
        auVar242._0_8_ = uVar791;
        auVar594._8_8_ = 0;
        auVar594._0_8_ = uVar794;
        auVar243._8_8_ = 0;
        auVar243._0_8_ = uVar812;
        auVar595._8_8_ = 0;
        auVar595._0_8_ = uVar795;
        auVar244._8_8_ = 0;
        auVar244._0_8_ = uVar811;
        auVar596._8_8_ = 0;
        auVar596._0_8_ = uVar798;
        auVar245._8_8_ = 0;
        auVar245._0_8_ = uVar810;
        auVar597._8_8_ = 0;
        auVar597._0_8_ = uVar803;
        auVar246._8_8_ = 0;
        auVar246._0_8_ = uVar799;
        auVar598._8_8_ = 0;
        auVar598._0_8_ = uVar793;
        auVar168 = auVar245 * auVar597 + auVar246 * auVar598 + (auVar168 >> 0x34);
        auVar247._8_8_ = 0;
        auVar247._0_8_ = auVar168._0_8_;
        auVar767 = auVar247 * ZEXT816(0x1000003d10) +
                   auVar244 * auVar596 + auVar243 * auVar595 + auVar242 * auVar594 + auVar767;
        auVar169 = auVar767 >> 0x34;
        auVar769._8_8_ = 0;
        auVar769._0_8_ = auVar169._0_8_;
        auVar248._8_8_ = 0;
        auVar248._0_8_ = auVar168._8_8_;
        auVar768._8_8_ = auVar169._8_8_;
        auVar768._0_8_ = local_100 & 0xfffffffffffff;
        auVar769 = auVar248 * ZEXT816(0x1000003d10000) + auVar768 + auVar769;
        uVar811 = auVar769._0_8_;
        uVar800 = (uVar800 & 0xfffffffffffff) * 4 + (auVar725._0_8_ & 0xfffffffffffff) * 3;
        uVar791 = (auVar767._0_8_ & 0xfffffffffffff) * 4 + local_1a0 * 3;
        uVar799 = (uVar811 & 0xfffffffffffff) * 4 + (uVar790 & 0xfffffffffffff) * 3;
        uVar790 = (uVar815 * 4 & 0x3ffffffffffffc) + (uVar808 & 0xfffffffffffff) * 3 + 0x1c;
        auVar249._8_8_ = 0;
        auVar249._0_8_ = uVar790;
        auVar599._8_8_ = 0;
        auVar599._0_8_ = uVar806;
        uVar808 = local_148 * 3 +
                  ((auVar769._8_8_ << 0xc | uVar811 >> 0x34) + (auVar167._0_8_ & 0xffffffffffff)) *
                  4;
        auVar250._8_8_ = 0;
        auVar250._0_8_ = uVar800;
        auVar600._8_8_ = 0;
        auVar600._0_8_ = uVar809;
        auVar251._8_8_ = 0;
        auVar251._0_8_ = uVar791;
        auVar601._8_8_ = 0;
        auVar601._0_8_ = uVar814;
        auVar252._8_8_ = 0;
        auVar252._0_8_ = uVar799;
        auVar602._8_8_ = 0;
        auVar602._0_8_ = uVar807;
        auVar253._8_8_ = 0;
        auVar253._0_8_ = uVar808;
        auVar603._8_8_ = 0;
        auVar603._0_8_ = uVar802;
        auVar254._8_8_ = 0;
        auVar254._0_8_ = SUB168(auVar253 * auVar603,0);
        auVar167 = auVar249 * auVar599 + auVar250 * auVar600 + auVar251 * auVar601 +
                   auVar252 * auVar602 + auVar254 * ZEXT816(0x1000003d10);
        auVar255._8_8_ = 0;
        auVar255._0_8_ = uVar790;
        auVar604._8_8_ = 0;
        auVar604._0_8_ = uVar802;
        auVar256._8_8_ = 0;
        auVar256._0_8_ = uVar800;
        auVar605._8_8_ = 0;
        auVar605._0_8_ = uVar806;
        auVar257._8_8_ = 0;
        auVar257._0_8_ = uVar791;
        auVar606._8_8_ = 0;
        auVar606._0_8_ = uVar809;
        auVar258._8_8_ = 0;
        auVar258._0_8_ = uVar799;
        auVar607._8_8_ = 0;
        auVar607._0_8_ = uVar814;
        auVar259._8_8_ = 0;
        auVar259._0_8_ = uVar808;
        auVar608._8_8_ = 0;
        auVar608._0_8_ = uVar807;
        auVar260._8_8_ = 0;
        auVar260._0_8_ = SUB168(auVar253 * auVar603,8);
        auVar168 = auVar260 * ZEXT816(0x1000003d10000) +
                   auVar259 * auVar608 +
                   auVar258 * auVar607 +
                   auVar257 * auVar606 + auVar256 * auVar605 + auVar255 * auVar604 +
                   (auVar167 >> 0x34);
        auVar261._8_8_ = 0;
        auVar261._0_8_ = uVar790;
        auVar609._8_8_ = 0;
        auVar609._0_8_ = uVar807;
        auVar262._8_8_ = 0;
        auVar262._0_8_ = uVar800;
        auVar610._8_8_ = 0;
        auVar610._0_8_ = uVar802;
        auVar263._8_8_ = 0;
        auVar263._0_8_ = uVar791;
        auVar611._8_8_ = 0;
        auVar611._0_8_ = uVar806;
        auVar264._8_8_ = 0;
        auVar264._0_8_ = uVar799;
        auVar612._8_8_ = 0;
        auVar612._0_8_ = uVar809;
        auVar265._8_8_ = 0;
        auVar265._0_8_ = uVar808;
        auVar613._8_8_ = 0;
        auVar613._0_8_ = uVar814;
        auVar169 = auVar265 * auVar613 +
                   auVar262 * auVar610 + auVar263 * auVar611 + auVar264 * auVar612 +
                   (auVar168 >> 0x34);
        auVar266._8_8_ = 0;
        auVar266._0_8_ = (auVar169._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar168._6_2_ & 0xf);
        auVar170 = auVar266 * ZEXT816(0x1000003d1) + auVar261 * auVar609;
        uVar815 = auVar170._0_8_;
        uVar811 = auVar170._8_8_;
        auVar786._8_8_ = uVar811 >> 0x34;
        auVar786._0_8_ = uVar811 * 0x1000 | uVar815 >> 0x34;
        auVar267._8_8_ = 0;
        auVar267._0_8_ = uVar790;
        auVar614._8_8_ = 0;
        auVar614._0_8_ = uVar814;
        auVar268._8_8_ = 0;
        auVar268._0_8_ = uVar800;
        auVar615._8_8_ = 0;
        auVar615._0_8_ = uVar807;
        auVar269._8_8_ = 0;
        auVar269._0_8_ = uVar791;
        auVar616._8_8_ = 0;
        auVar616._0_8_ = uVar802;
        auVar270._8_8_ = 0;
        auVar270._0_8_ = uVar799;
        auVar617._8_8_ = 0;
        auVar617._0_8_ = uVar806;
        auVar271._8_8_ = 0;
        auVar271._0_8_ = uVar808;
        auVar618._8_8_ = 0;
        auVar618._0_8_ = uVar809;
        auVar169 = auVar271 * auVar618 + auVar270 * auVar617 + auVar269 * auVar616 +
                   (auVar169 >> 0x34);
        auVar272._8_8_ = 0;
        auVar272._0_8_ = auVar169._0_8_ & 0xfffffffffffff;
        auVar786 = auVar272 * ZEXT816(0x1000003d10) + auVar267 * auVar614 + auVar268 * auVar615 +
                   auVar786;
        uVar811 = auVar786._0_8_;
        uVar810 = auVar786._8_8_;
        auVar726._8_8_ = uVar810 >> 0x34;
        auVar726._0_8_ = uVar810 * 0x1000 | uVar811 >> 0x34;
        auVar273._8_8_ = 0;
        auVar273._0_8_ = uVar790;
        auVar619._8_8_ = 0;
        auVar619._0_8_ = uVar809;
        auVar274._8_8_ = 0;
        auVar274._0_8_ = uVar800;
        auVar620._8_8_ = 0;
        auVar620._0_8_ = uVar814;
        auVar275._8_8_ = 0;
        auVar275._0_8_ = uVar791;
        auVar621._8_8_ = 0;
        auVar621._0_8_ = uVar807;
        auVar276._8_8_ = 0;
        auVar276._0_8_ = uVar799;
        auVar622._8_8_ = 0;
        auVar622._0_8_ = uVar802;
        auVar277._8_8_ = 0;
        auVar277._0_8_ = uVar808;
        auVar623._8_8_ = 0;
        auVar623._0_8_ = uVar806;
        auVar169 = auVar277 * auVar623 + auVar276 * auVar622 + (auVar169 >> 0x34);
        auVar278._8_8_ = 0;
        auVar278._0_8_ = auVar169._0_8_;
        auVar726 = auVar278 * ZEXT816(0x1000003d10) +
                   auVar275 * auVar621 + auVar273 * auVar619 + auVar274 * auVar620 + auVar726;
        auVar170 = auVar726 >> 0x34;
        auVar771._8_8_ = 0;
        auVar771._0_8_ = auVar170._0_8_;
        auVar279._8_8_ = 0;
        auVar279._0_8_ = auVar169._8_8_;
        auVar770._8_8_ = auVar170._8_8_;
        auVar770._0_8_ = auVar167._0_8_ & 0xfffffffffffff;
        auVar771 = auVar279 * ZEXT816(0x1000003d10000) + auVar770 + auVar771;
        uVar802 = auVar771._0_8_;
        local_f8.n[0] = 0x3ffffbfffff0bc - (uVar815 & 0xfffffffffffff);
        local_f8.n[1] = 0x3ffffffffffffc - (uVar811 & 0xfffffffffffff);
        local_f8.n[2] = 0x3ffffffffffffc - (auVar726._0_8_ & 0xfffffffffffff);
        local_f8.n[3] = 0x3ffffffffffffc - (uVar802 & 0xfffffffffffff);
        local_f8.n[4] =
             0x3fffffffffffc -
             ((auVar771._8_8_ << 0xc | uVar802 >> 0x34) + (auVar168._0_8_ & 0xffffffffffff));
        iVar787 = secp256k1_fe_impl_is_square_var(&local_f8);
        if (iVar787 != 0) {
          secp256k1_fe_sqrt(&local_d0,&local_f8);
          if ((local_18c & 1) != 0) {
            iVar787 = secp256k1_fe_impl_normalizes_to_zero_var(&local_d0);
            if (iVar787 != 0) goto LAB_0023714f;
          }
          iVar787 = secp256k1_fe_impl_normalizes_to_zero_var(&local_188);
          if (iVar787 == 0) {
            secp256k1_fe_impl_inv_var(&local_130,&local_188);
            auVar280._8_8_ = 0;
            auVar280._0_8_ = local_d0.n[3];
            auVar624._8_8_ = 0;
            auVar624._0_8_ = local_130.n[0];
            auVar281._8_8_ = 0;
            auVar281._0_8_ = local_d0.n[2];
            auVar625._8_8_ = 0;
            auVar625._0_8_ = local_130.n[1];
            auVar282._8_8_ = 0;
            auVar282._0_8_ = local_d0.n[1];
            auVar626._8_8_ = 0;
            auVar626._0_8_ = local_130.n[2];
            auVar283._8_8_ = 0;
            auVar283._0_8_ = local_d0.n[0];
            auVar627._8_8_ = 0;
            auVar627._0_8_ = local_130.n[3];
            auVar284._8_8_ = 0;
            auVar284._0_8_ = local_d0.n[4];
            auVar628._8_8_ = 0;
            auVar628._0_8_ = local_130.n[4];
            auVar285._8_8_ = 0;
            auVar285._0_8_ = SUB168(auVar284 * auVar628,0);
            auVar170 = auVar281 * auVar625 + auVar280 * auVar624 + auVar282 * auVar626 +
                       auVar283 * auVar627 + auVar285 * ZEXT816(0x1000003d10);
            auVar286._8_8_ = 0;
            auVar286._0_8_ = local_d0.n[4];
            auVar629._8_8_ = 0;
            auVar629._0_8_ = local_130.n[0];
            auVar287._8_8_ = 0;
            auVar287._0_8_ = local_d0.n[3];
            auVar630._8_8_ = 0;
            auVar630._0_8_ = local_130.n[1];
            auVar288._8_8_ = 0;
            auVar288._0_8_ = local_d0.n[2];
            auVar631._8_8_ = 0;
            auVar631._0_8_ = local_130.n[2];
            auVar289._8_8_ = 0;
            auVar289._0_8_ = local_d0.n[1];
            auVar632._8_8_ = 0;
            auVar632._0_8_ = local_130.n[3];
            auVar290._8_8_ = 0;
            auVar290._0_8_ = local_d0.n[0];
            auVar633._8_8_ = 0;
            auVar633._0_8_ = local_130.n[4];
            auVar291._8_8_ = 0;
            auVar291._0_8_ = SUB168(auVar284 * auVar628,8);
            auVar167 = auVar291 * ZEXT816(0x1000003d10000) +
                       auVar290 * auVar633 +
                       auVar289 * auVar632 + auVar288 * auVar631 + auVar287 * auVar630 +
                       auVar286 * auVar629 + (auVar170 >> 0x34);
            auVar292._8_8_ = 0;
            auVar292._0_8_ = local_d0.n[0];
            auVar634._8_8_ = 0;
            auVar634._0_8_ = local_130.n[0];
            auVar293._8_8_ = 0;
            auVar293._0_8_ = local_d0.n[4];
            auVar635._8_8_ = 0;
            auVar635._0_8_ = local_130.n[1];
            auVar294._8_8_ = 0;
            auVar294._0_8_ = local_d0.n[3];
            auVar636._8_8_ = 0;
            auVar636._0_8_ = local_130.n[2];
            auVar295._8_8_ = 0;
            auVar295._0_8_ = local_d0.n[2];
            auVar637._8_8_ = 0;
            auVar637._0_8_ = local_130.n[3];
            auVar296._8_8_ = 0;
            auVar296._0_8_ = local_d0.n[1];
            auVar638._8_8_ = 0;
            auVar638._0_8_ = local_130.n[4];
            auVar168 = auVar296 * auVar638 + auVar295 * auVar637 + auVar294 * auVar636 +
                       auVar293 * auVar635 + (auVar167 >> 0x34);
            auVar297._8_8_ = 0;
            auVar297._0_8_ = (auVar168._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar167._6_2_ & 0xf)
            ;
            auVar169 = auVar297 * ZEXT816(0x1000003d1) + auVar292 * auVar634;
            uVar802 = auVar169._0_8_;
            uVar806 = auVar169._8_8_;
            auVar727._8_8_ = uVar806 >> 0x34;
            auVar727._0_8_ = uVar806 * 0x1000 | uVar802 >> 0x34;
            auVar298._8_8_ = 0;
            auVar298._0_8_ = local_d0.n[1];
            auVar639._8_8_ = 0;
            auVar639._0_8_ = local_130.n[0];
            local_198 = SUB168(auVar298 * auVar639,0);
            auVar299._8_8_ = 0;
            auVar299._0_8_ = local_d0.n[0];
            auVar640._8_8_ = 0;
            auVar640._0_8_ = local_130.n[1];
            auVar300._8_8_ = 0;
            auVar300._0_8_ = local_d0.n[4];
            auVar641._8_8_ = 0;
            auVar641._0_8_ = local_130.n[2];
            auVar301._8_8_ = 0;
            auVar301._0_8_ = local_d0.n[3];
            auVar642._8_8_ = 0;
            auVar642._0_8_ = local_130.n[3];
            auVar302._8_8_ = 0;
            auVar302._0_8_ = local_d0.n[2];
            auVar643._8_8_ = 0;
            auVar643._0_8_ = local_130.n[4];
            auVar168 = auVar300 * auVar641 + auVar302 * auVar643 + auVar301 * auVar642 +
                       (auVar168 >> 0x34);
            auVar303._8_8_ = 0;
            auVar303._0_8_ = auVar168._0_8_ & 0xfffffffffffff;
            auVar727 = auVar303 * ZEXT816(0x1000003d10) + auVar298 * auVar639 + auVar299 * auVar640
                       + auVar727;
            auVar304._8_8_ = 0;
            auVar304._0_8_ = local_d0.n[2];
            auVar644._8_8_ = 0;
            auVar644._0_8_ = local_130.n[0];
            auVar305._8_8_ = 0;
            auVar305._0_8_ = local_d0.n[1];
            auVar645._8_8_ = 0;
            auVar645._0_8_ = local_130.n[1];
            auVar306._8_8_ = 0;
            auVar306._0_8_ = local_d0.n[0];
            auVar646._8_8_ = 0;
            auVar646._0_8_ = local_130.n[2];
            auVar307._8_8_ = 0;
            auVar307._0_8_ = local_d0.n[4];
            auVar647._8_8_ = 0;
            auVar647._0_8_ = local_130.n[3];
            auVar308._8_8_ = 0;
            auVar308._0_8_ = local_d0.n[3];
            auVar648._8_8_ = 0;
            auVar648._0_8_ = local_130.n[4];
            auVar168 = auVar308 * auVar648 + auVar307 * auVar647 + (auVar168 >> 0x34);
            auVar309._8_8_ = 0;
            auVar309._0_8_ = auVar168._0_8_;
            auVar169 = auVar309 * ZEXT816(0x1000003d10) +
                       auVar306 * auVar646 + auVar305 * auVar645 + auVar304 * auVar644 +
                       (auVar727 >> 0x34);
            auVar171 = auVar169 >> 0x34;
            auVar773._8_8_ = 0;
            auVar773._0_8_ = auVar171._0_8_;
            auVar310._8_8_ = 0;
            auVar310._0_8_ = auVar168._8_8_;
            auVar772._8_8_ = auVar171._8_8_;
            auVar772._0_8_ = auVar170._0_8_ & 0xfffffffffffff;
            auVar773 = auVar310 * ZEXT816(0x1000003d10000) + auVar772 + auVar773;
            uVar806 = auVar773._0_8_;
            lVar792 = (uVar802 & 0xfffffffffffff) + uVar804;
            lVar813 = (auVar727._0_8_ & 0xfffffffffffff) + uVar788;
            lVar801 = (auVar169._0_8_ & 0xfffffffffffff) + uVar789;
            lVar797 = (uVar806 & 0xfffffffffffff) + uVar796;
            uVar802 = -(ulong)((uint)lVar792 & 1);
            uVar807 = uVar802 >> 0xc;
            local_130.n[4] =
                 (uVar802 >> 0x10) + (auVar167._0_8_ & 0xffffffffffff) + uVar805 +
                 (auVar773._8_8_ << 0xc | uVar806 >> 0x34);
            iVar787 = (int)uVar807;
            local_130.n[0] =
                 ((ulong)(iVar787 + (int)lVar813 & 1) << 0x33) +
                 ((uVar807 & 0xffffefffffc2f) + lVar792 >> 1);
            local_130.n[1] =
                 ((ulong)((int)lVar801 + iVar787 & 1) << 0x33) + (lVar813 + uVar807 >> 1);
            local_130.n[2] =
                 ((ulong)((int)lVar797 + iVar787 & 1) << 0x33) + (lVar801 + uVar807 >> 1);
            local_130.n[3] = ((ulong)((uint)local_130.n[4] & 1) << 0x33) + (uVar807 + lVar797 >> 1);
            local_130.n[4] = local_130.n[4] >> 1;
            goto LAB_00237637;
          }
        }
      }
    }
LAB_0023714f:
    cnt = cnt_00 + 1;
    iVar787 = (int)local_198;
  } while( true );
}

Assistant:

static void secp256k1_ellswift_elligatorswift_var(unsigned char *u32, secp256k1_fe *t, const secp256k1_ge *p, const secp256k1_sha256 *hasher) {
    secp256k1_ellswift_xelligatorswift_var(u32, t, &p->x, hasher);
    secp256k1_fe_normalize_var(t);
    if (secp256k1_fe_is_odd(t) != secp256k1_fe_is_odd(&p->y)) {
        secp256k1_fe_negate(t, t, 1);
        secp256k1_fe_normalize_var(t);
    }
}